

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined8 uVar62;
  undefined8 uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  byte bVar66;
  Geometry *geometry;
  long lVar67;
  ulong uVar68;
  ulong uVar69;
  bool bVar70;
  ulong uVar71;
  undefined8 unaff_R13;
  long lVar72;
  ulong uVar73;
  byte bVar74;
  float fVar75;
  float fVar76;
  float fVar126;
  float fVar128;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar86 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar87 [16];
  float fVar127;
  float fVar129;
  float fVar131;
  float fVar132;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar130;
  float fVar133;
  float fVar134;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined4 uVar135;
  float fVar141;
  float fVar142;
  vint4 bi_2;
  float fVar143;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [64];
  undefined8 uVar144;
  vint4 bi_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  float fVar151;
  vint4 ai_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar171;
  float fVar175;
  vint4 ai_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  uint uVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  LinearSpace3fa *local_750;
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [64];
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  uint uStack_610;
  uint uStack_60c;
  uint uStack_608;
  uint uStack_604;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar73 = (ulong)(byte)prim[1];
  fVar151 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar84 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar152._0_4_ = fVar151 * auVar84._0_4_;
  auVar152._4_4_ = fVar151 * auVar84._4_4_;
  auVar152._8_4_ = fVar151 * auVar84._8_4_;
  auVar152._12_4_ = fVar151 * auVar84._12_4_;
  auVar86._0_4_ = fVar151 * auVar83._0_4_;
  auVar86._4_4_ = fVar151 * auVar83._4_4_;
  auVar86._8_4_ = fVar151 * auVar83._8_4_;
  auVar86._12_4_ = fVar151 * auVar83._12_4_;
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xc + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xd + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x12 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x13 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x14 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar184._4_4_ = auVar86._0_4_;
  auVar184._0_4_ = auVar86._0_4_;
  auVar184._8_4_ = auVar86._0_4_;
  auVar184._12_4_ = auVar86._0_4_;
  auVar85 = vshufps_avx(auVar86,auVar86,0x55);
  auVar80 = vshufps_avx(auVar86,auVar86,0xaa);
  fVar151 = auVar80._0_4_;
  auVar162._0_4_ = fVar151 * auVar77._0_4_;
  fVar141 = auVar80._4_4_;
  auVar162._4_4_ = fVar141 * auVar77._4_4_;
  fVar142 = auVar80._8_4_;
  auVar162._8_4_ = fVar142 * auVar77._8_4_;
  fVar143 = auVar80._12_4_;
  auVar162._12_4_ = fVar143 * auVar77._12_4_;
  auVar145._0_4_ = auVar78._0_4_ * fVar151;
  auVar145._4_4_ = auVar78._4_4_ * fVar141;
  auVar145._8_4_ = auVar78._8_4_ * fVar142;
  auVar145._12_4_ = auVar78._12_4_ * fVar143;
  auVar136._0_4_ = auVar79._0_4_ * fVar151;
  auVar136._4_4_ = auVar79._4_4_ * fVar141;
  auVar136._8_4_ = auVar79._8_4_ * fVar142;
  auVar136._12_4_ = auVar79._12_4_ * fVar143;
  auVar80 = vfmadd231ps_fma(auVar162,auVar85,auVar83);
  auVar82 = vfmadd231ps_fma(auVar145,auVar85,auVar27);
  auVar85 = vfmadd231ps_fma(auVar136,auVar29,auVar85);
  auVar81 = vfmadd231ps_fma(auVar80,auVar184,auVar84);
  auVar82 = vfmadd231ps_fma(auVar82,auVar184,auVar147);
  auVar86 = vfmadd231ps_fma(auVar85,auVar28,auVar184);
  auVar185._4_4_ = auVar152._0_4_;
  auVar185._0_4_ = auVar152._0_4_;
  auVar185._8_4_ = auVar152._0_4_;
  auVar185._12_4_ = auVar152._0_4_;
  auVar85 = vshufps_avx(auVar152,auVar152,0x55);
  auVar80 = vshufps_avx(auVar152,auVar152,0xaa);
  auVar77 = vmulps_avx512vl(auVar80,auVar77);
  auVar153._0_4_ = auVar80._0_4_ * auVar78._0_4_;
  auVar153._4_4_ = auVar80._4_4_ * auVar78._4_4_;
  auVar153._8_4_ = auVar80._8_4_ * auVar78._8_4_;
  auVar153._12_4_ = auVar80._12_4_ * auVar78._12_4_;
  auVar87._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar87._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar87._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar87._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar78 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar83);
  auVar83 = vfmadd231ps_fma(auVar153,auVar85,auVar27);
  auVar77 = vfmadd231ps_fma(auVar87,auVar85,auVar29);
  auVar79 = vfmadd231ps_avx512vl(auVar78,auVar185,auVar84);
  auVar78 = vfmadd231ps_fma(auVar83,auVar185,auVar147);
  auVar29 = vfmadd231ps_fma(auVar77,auVar185,auVar28);
  auVar176._8_4_ = 0x7fffffff;
  auVar176._0_8_ = 0x7fffffff7fffffff;
  auVar176._12_4_ = 0x7fffffff;
  auVar84 = vandps_avx(auVar81,auVar176);
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar84,auVar172,1);
  bVar70 = (bool)((byte)uVar69 & 1);
  auVar80._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar81._0_4_;
  bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar81._4_4_;
  bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar81._8_4_;
  bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar81._12_4_;
  auVar84 = vandps_avx(auVar82,auVar176);
  uVar69 = vcmpps_avx512vl(auVar84,auVar172,1);
  bVar70 = (bool)((byte)uVar69 & 1);
  auVar81._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar82._0_4_;
  bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar82._4_4_;
  bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar82._8_4_;
  bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar82._12_4_;
  auVar84 = vandps_avx(auVar86,auVar176);
  uVar69 = vcmpps_avx512vl(auVar84,auVar172,1);
  bVar70 = (bool)((byte)uVar69 & 1);
  auVar82._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar86._0_4_;
  bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar86._4_4_;
  bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar86._8_4_;
  bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar86._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = 0x3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar80,auVar83,auVar173);
  auVar77 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar84 = vfnmadd213ps_fma(auVar81,auVar83,auVar173);
  auVar27 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar82);
  auVar84 = vfnmadd213ps_fma(auVar82,auVar83,auVar173);
  auVar28 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx512vl(auVar84,auVar79);
  auVar168._0_4_ = auVar77._0_4_ * auVar84._0_4_;
  auVar168._4_4_ = auVar77._4_4_ * auVar84._4_4_;
  auVar168._8_4_ = auVar77._8_4_ * auVar84._8_4_;
  auVar168._12_4_ = auVar77._12_4_ * auVar84._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar84 = vpmovsxwd_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx512vl(auVar84,auVar79);
  auVar163._0_4_ = auVar77._0_4_ * auVar84._0_4_;
  auVar163._4_4_ = auVar77._4_4_ * auVar84._4_4_;
  auVar163._8_4_ = auVar77._8_4_ * auVar84._8_4_;
  auVar163._12_4_ = auVar77._12_4_ * auVar84._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar73 * 0xe + 6);
  auVar84 = vpmovsxwd_avx(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83 = vsubps_avx(auVar84,auVar78);
  auVar77 = vpbroadcastd_avx512vl();
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar84 = vpmovsxwd_avx(auVar147);
  auVar174._0_4_ = auVar27._0_4_ * auVar83._0_4_;
  auVar174._4_4_ = auVar27._4_4_ * auVar83._4_4_;
  auVar174._8_4_ = auVar27._8_4_ * auVar83._8_4_;
  auVar174._12_4_ = auVar27._12_4_ * auVar83._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar78);
  auVar146._0_4_ = auVar27._0_4_ * auVar84._0_4_;
  auVar146._4_4_ = auVar27._4_4_ * auVar84._4_4_;
  auVar146._8_4_ = auVar27._8_4_ * auVar84._8_4_;
  auVar146._12_4_ = auVar27._12_4_ * auVar84._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar73 * 0x15 + 6);
  auVar84 = vpmovsxwd_avx(auVar27);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar29);
  auVar154._0_4_ = auVar28._0_4_ * auVar84._0_4_;
  auVar154._4_4_ = auVar28._4_4_ * auVar84._4_4_;
  auVar154._8_4_ = auVar28._8_4_ * auVar84._8_4_;
  auVar154._12_4_ = auVar28._12_4_ * auVar84._12_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar84 = vpmovsxwd_avx(auVar78);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar29);
  auVar137._0_4_ = auVar28._0_4_ * auVar84._0_4_;
  auVar137._4_4_ = auVar28._4_4_ * auVar84._4_4_;
  auVar137._8_4_ = auVar28._8_4_ * auVar84._8_4_;
  auVar137._12_4_ = auVar28._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar168,auVar163);
  auVar83 = vpminsd_avx(auVar174,auVar146);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar83 = vpminsd_avx(auVar154,auVar137);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar28._4_4_ = uVar135;
  auVar28._0_4_ = uVar135;
  auVar28._8_4_ = uVar135;
  auVar28._12_4_ = uVar135;
  auVar83 = vmaxps_avx512vl(auVar83,auVar28);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar29._8_4_ = 0x3f7ffffa;
  auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar29._12_4_ = 0x3f7ffffa;
  local_5f0 = vmulps_avx512vl(auVar84,auVar29);
  auVar84 = vpmaxsd_avx(auVar168,auVar163);
  auVar83 = vpmaxsd_avx(auVar174,auVar146);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar83 = vpmaxsd_avx(auVar154,auVar137);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar79._4_4_ = uVar135;
  auVar79._0_4_ = uVar135;
  auVar79._8_4_ = uVar135;
  auVar79._12_4_ = uVar135;
  auVar83 = vminps_avx512vl(auVar83,auVar79);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar85);
  uVar30 = vcmpps_avx512vl(local_5f0,auVar84,2);
  uVar32 = vpcmpgtd_avx512vl(auVar77,_DAT_01f4ad30);
  local_748 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar30 & 0xf & (byte)uVar32));
  local_750 = pre->ray_space + k;
  auVar140 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_340 = vmovdqa64_avx512f(auVar140);
  while (auVar140 = local_480, local_748 != 0) {
    lVar72 = 0;
    for (uVar69 = local_748; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      lVar72 = lVar72 + 1;
    }
    uVar8 = *(uint *)(prim + 2);
    pGVar10 = (context->scene->geometries).items[uVar8].ptr;
    uVar69 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(prim + lVar72 * 4 + 6));
    p_Var11 = pGVar10[1].intersectionFilterN;
    lVar72 = *(long *)&pGVar10[1].time_range.upper;
    auVar84 = *(undefined1 (*) [16])(lVar72 + (long)p_Var11 * uVar69);
    pauVar3 = (undefined1 (*) [16])(lVar72 + (uVar69 + 1) * (long)p_Var11);
    uVar30 = *(undefined8 *)*pauVar3;
    uVar32 = *(undefined8 *)(*pauVar3 + 8);
    auVar28 = *pauVar3;
    auVar27 = *pauVar3;
    auVar83 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar72 + (uVar69 + 2) * (long)p_Var11);
    uVar62 = *(undefined8 *)*pauVar4;
    uVar63 = *(undefined8 *)(*pauVar4 + 8);
    auVar78 = *pauVar4;
    auVar147 = *pauVar4;
    auVar77 = *pauVar4;
    uVar73 = local_748 - 1 & local_748;
    pauVar5 = (undefined1 (*) [12])(lVar72 + (uVar69 + 3) * (long)p_Var11);
    local_760 = (float)*(undefined8 *)*pauVar5;
    fStack_75c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
    fStack_758 = (float)*(undefined8 *)(*pauVar5 + 8);
    fStack_754 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
    if (uVar73 != 0) {
      uVar71 = uVar73 - 1 & uVar73;
      for (uVar69 = uVar73; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      }
      if (uVar71 != 0) {
        for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                            0x1c);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar85 = vsubps_avx(auVar84,auVar29);
    uVar135 = auVar85._0_4_;
    auVar149._4_4_ = uVar135;
    auVar149._0_4_ = uVar135;
    auVar149._8_4_ = uVar135;
    auVar149._12_4_ = uVar135;
    auVar79 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    aVar6 = (local_750->vx).field_0;
    aVar7 = (local_750->vy).field_0;
    fVar151 = (local_750->vz).field_0.m128[0];
    fVar141 = *(float *)((long)&(local_750->vz).field_0 + 4);
    fVar142 = *(float *)((long)&(local_750->vz).field_0 + 8);
    fVar143 = *(float *)((long)&(local_750->vz).field_0 + 0xc);
    auVar179._0_4_ = fVar151 * auVar85._0_4_;
    auVar179._4_4_ = fVar141 * auVar85._4_4_;
    auVar179._8_4_ = fVar142 * auVar85._8_4_;
    auVar179._12_4_ = fVar143 * auVar85._12_4_;
    auVar79 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar7,auVar79);
    auVar82 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar149);
    auVar79 = vshufps_avx(auVar84,auVar84,0xff);
    auVar80 = vsubps_avx(auVar83,auVar29);
    uVar135 = auVar80._0_4_;
    auVar155._4_4_ = uVar135;
    auVar155._0_4_ = uVar135;
    auVar155._8_4_ = uVar135;
    auVar155._12_4_ = uVar135;
    auVar85 = vshufps_avx(auVar80,auVar80,0x55);
    auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
    auVar180._0_4_ = fVar151 * auVar80._0_4_;
    auVar180._4_4_ = fVar141 * auVar80._4_4_;
    auVar180._8_4_ = fVar142 * auVar80._8_4_;
    auVar180._12_4_ = fVar143 * auVar80._12_4_;
    auVar85 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar7,auVar85);
    auVar81 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar6,auVar155);
    auVar83 = vshufps_avx(auVar83,auVar83,0xff);
    auVar80 = vsubps_avx(auVar77,auVar29);
    uVar135 = auVar80._0_4_;
    auVar177._4_4_ = uVar135;
    auVar177._0_4_ = uVar135;
    auVar177._8_4_ = uVar135;
    auVar177._12_4_ = uVar135;
    auVar85 = vshufps_avx(auVar80,auVar80,0x55);
    auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
    auVar183._0_4_ = fVar151 * auVar80._0_4_;
    auVar183._4_4_ = fVar141 * auVar80._4_4_;
    auVar183._8_4_ = fVar142 * auVar80._8_4_;
    auVar183._12_4_ = fVar143 * auVar80._12_4_;
    auVar85 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar7,auVar85);
    auVar80 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar6,auVar177);
    auVar77 = vshufps_avx(auVar77,auVar77,0xff);
    auVar64._12_4_ = fStack_754;
    auVar64._0_12_ = *pauVar5;
    auVar85 = vsubps_avx512vl(auVar64,auVar29);
    uVar135 = auVar85._0_4_;
    auVar156._4_4_ = uVar135;
    auVar156._0_4_ = uVar135;
    auVar156._8_4_ = uVar135;
    auVar156._12_4_ = uVar135;
    auVar29 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar186._0_4_ = fVar151 * auVar85._0_4_;
    auVar186._4_4_ = fVar141 * auVar85._4_4_;
    auVar186._8_4_ = fVar142 * auVar85._8_4_;
    auVar186._12_4_ = fVar143 * auVar85._12_4_;
    auVar29 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar7,auVar29);
    auVar29 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar6,auVar156);
    auVar85 = vshufps_avx512vl(auVar64,auVar64,0xff);
    lVar72 = (long)iVar9 * 0x44;
    auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72);
    local_700 = vbroadcastss_avx512vl(auVar82);
    auVar88._8_4_ = 1;
    auVar88._0_8_ = 0x100000001;
    auVar88._12_4_ = 1;
    auVar88._16_4_ = 1;
    auVar88._20_4_ = 1;
    auVar88._24_4_ = 1;
    auVar88._28_4_ = 1;
    local_6e0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar82));
    uVar144 = auVar79._0_8_;
    local_360._8_8_ = uVar144;
    local_360._0_8_ = uVar144;
    local_360._16_8_ = uVar144;
    local_360._24_8_ = uVar144;
    auVar105 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x484);
    uVar135 = auVar81._0_4_;
    local_820._4_4_ = uVar135;
    local_820._0_4_ = uVar135;
    local_820._8_4_ = uVar135;
    local_820._12_4_ = uVar135;
    local_820._16_4_ = uVar135;
    local_820._20_4_ = uVar135;
    local_820._24_4_ = uVar135;
    local_820._28_4_ = uVar135;
    local_800 = vpermps_avx512vl(auVar88,ZEXT1632(auVar81));
    uVar144 = auVar83._0_8_;
    local_380._8_8_ = uVar144;
    local_380._0_8_ = uVar144;
    local_380._16_8_ = uVar144;
    local_380._24_8_ = uVar144;
    auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x908);
    local_7a0 = vbroadcastss_avx512vl(auVar80);
    local_720 = vpermps_avx2(auVar88,ZEXT1632(auVar80));
    local_3a0 = vbroadcastsd_avx512vl(auVar77);
    auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0xd8c);
    local_7c0 = vbroadcastss_avx512vl(auVar29);
    auVar196 = ZEXT3264(local_7c0);
    local_7e0 = vpermps_avx512vl(auVar88,ZEXT1632(auVar29));
    auVar197 = ZEXT3264(local_7e0);
    _local_3c0 = vbroadcastsd_avx512vl(auVar85);
    auVar88 = vmulps_avx512vl(local_7c0,auVar102);
    auVar89 = vmulps_avx512vl(local_7e0,auVar102);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar103,local_7a0);
    auVar83 = vfmadd231ps_fma(auVar89,auVar103,local_720);
    auVar77 = vfmadd231ps_fma(auVar88,auVar105,local_820);
    auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar105,local_800);
    auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar104,local_700);
    auVar91 = vfmadd231ps_avx512vl(auVar88,auVar104,local_6e0);
    auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72);
    auVar89 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x484);
    auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x908);
    auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0xd8c);
    auVar92 = vmulps_avx512vl(local_7c0,auVar100);
    auVar93 = vmulps_avx512vl(local_7e0,auVar100);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar101,local_7a0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,local_720);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_820);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_800);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_700);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_6e0);
    auVar94 = vsubps_avx512vl(auVar92,auVar90);
    auVar95 = vsubps_avx512vl(auVar93,auVar91);
    auVar96 = vmulps_avx512vl(auVar91,auVar94);
    auVar97 = vmulps_avx512vl(auVar90,auVar95);
    auVar96 = vsubps_avx512vl(auVar96,auVar97);
    auVar97 = vmulps_avx512vl(_local_3c0,auVar102);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_3a0);
    auVar83 = vfmadd231ps_fma(auVar97,auVar105,local_380);
    auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar104,local_360);
    auVar98 = vmulps_avx512vl(_local_3c0,auVar100);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_3a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,local_380);
    auVar79 = vfmadd231ps_fma(auVar98,auVar88,local_360);
    auVar98 = vmulps_avx512vl(auVar95,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar94);
    auVar99 = vmaxps_avx512vl(auVar97,ZEXT1632(auVar79));
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar98 = vmulps_avx512vl(auVar99,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    uVar144 = vcmpps_avx512vl(auVar96,auVar98,2);
    auVar83 = vblendps_avx(auVar82,auVar84,8);
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar77 = vandps_avx512vl(auVar83,auVar85);
    auVar83 = vblendps_avx(auVar81,*pauVar3,8);
    auVar83 = vandps_avx512vl(auVar83,auVar85);
    auVar77 = vmaxps_avx(auVar77,auVar83);
    auVar83 = vblendps_avx(auVar80,*pauVar4,8);
    auVar86 = vandps_avx512vl(auVar83,auVar85);
    auVar83 = vblendps_avx(auVar29,auVar64,8);
    auVar83 = vandps_avx512vl(auVar83,auVar85);
    auVar83 = vmaxps_avx(auVar86,auVar83);
    auVar83 = vmaxps_avx(auVar77,auVar83);
    auVar77 = vmovshdup_avx(auVar83);
    auVar77 = vmaxss_avx(auVar77,auVar83);
    auVar83 = vshufpd_avx(auVar83,auVar83,1);
    local_480._0_4_ = (undefined4)iVar9;
    local_480._4_12_ = auVar82._4_12_;
    auVar83 = vmaxss_avx(auVar83,auVar77);
    local_480._16_48_ = auVar140._16_48_;
    auVar98._4_4_ = local_480._0_4_;
    auVar98._0_4_ = local_480._0_4_;
    auVar98._8_4_ = local_480._0_4_;
    auVar98._12_4_ = local_480._0_4_;
    auVar98._16_4_ = local_480._0_4_;
    auVar98._20_4_ = local_480._0_4_;
    auVar98._24_4_ = local_480._0_4_;
    auVar98._28_4_ = local_480._0_4_;
    uVar31 = vcmpps_avx512vl(auVar98,_DAT_01f7b060,0xe);
    bVar74 = (byte)uVar144 & (byte)uVar31;
    auVar83 = vmulss_avx512f(auVar83,ZEXT416(0x35000000));
    auVar96._8_4_ = 2;
    auVar96._0_8_ = 0x200000002;
    auVar96._12_4_ = 2;
    auVar96._16_4_ = 2;
    auVar96._20_4_ = 2;
    auVar96._24_4_ = 2;
    auVar96._28_4_ = 2;
    local_3e0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar82));
    local_400 = vpermps_avx512vl(auVar96,ZEXT1632(auVar81));
    local_420 = vpermps_avx512vl(auVar96,ZEXT1632(auVar80));
    local_780 = vpermps_avx2(auVar96,ZEXT1632(auVar29));
    uVar182 = *(uint *)(ray + k * 4 + 0xc0);
    auVar140 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar140);
    auVar77 = local_3e0._0_16_;
    if (bVar74 == 0) {
      bVar70 = false;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar190 = ZEXT3264(auVar104);
      auVar77 = vxorps_avx512vl(auVar77,auVar77);
      auVar191 = ZEXT1664(auVar77);
      auVar192 = ZEXT3264(local_700);
      auVar193 = ZEXT3264(local_6e0);
      auVar189 = ZEXT3264(local_820);
      auVar140 = ZEXT3264(local_800);
      auVar194 = ZEXT3264(local_7a0);
      auVar195 = ZEXT3264(local_720);
    }
    else {
      local_740._0_16_ = ZEXT416(uVar182);
      local_6c0._0_16_ = auVar83;
      auVar100 = vmulps_avx512vl(local_780,auVar100);
      auVar101 = vfmadd213ps_avx512vl(auVar101,local_420,auVar100);
      auVar89 = vfmadd213ps_avx512vl(auVar89,local_400,auVar101);
      auVar100 = vfmadd213ps_avx512vl(auVar88,local_3e0,auVar89);
      auVar102 = vmulps_avx512vl(local_780,auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_420,auVar102);
      auVar89 = vfmadd213ps_avx512vl(auVar105,local_400,auVar103);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1694);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1b18);
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar72 + 0x1f9c);
      auVar96 = vfmadd213ps_avx512vl(auVar104,local_3e0,auVar89);
      auVar104 = vmulps_avx512vl(local_7c0,auVar88);
      auVar89 = vmulps_avx512vl(local_7e0,auVar88);
      auVar88 = vmulps_avx512vl(local_780,auVar88);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_7a0);
      auVar29 = vfmadd231ps_fma(auVar89,auVar102,local_720);
      auVar102 = vfmadd231ps_avx512vl(auVar88,local_420,auVar102);
      auVar85 = vfmadd231ps_fma(auVar104,auVar103,local_820);
      auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar103,local_800);
      auVar88 = vfmadd231ps_avx512vl(auVar102,local_400,auVar103);
      auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar105,local_700);
      auVar101 = vfmadd231ps_avx512vl(auVar104,auVar105,local_6e0);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1b18);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1f9c);
      auVar88 = vfmadd231ps_avx512vl(auVar88,local_3e0,auVar105);
      auVar105 = vmulps_avx512vl(local_7c0,auVar102);
      auVar98 = vmulps_avx512vl(local_7e0,auVar102);
      auVar102 = vmulps_avx512vl(local_780,auVar102);
      auVar198 = ZEXT1664(auVar83);
      auVar99 = vfmadd231ps_avx512vl(auVar105,auVar103,local_7a0);
      auVar29 = vfmadd231ps_fma(auVar98,auVar103,local_720);
      auVar195 = ZEXT3264(local_720);
      auVar103 = vfmadd231ps_avx512vl(auVar102,local_420,auVar103);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar72 + 0x1694);
      auVar102 = vfmadd231ps_avx512vl(auVar99,auVar105,local_820);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar105,local_800);
      auVar105 = vfmadd231ps_avx512vl(auVar103,local_400,auVar105);
      auVar103 = vfmadd231ps_avx512vl(auVar102,auVar104,local_700);
      auVar102 = vfmadd231ps_avx512vl(auVar98,auVar104,local_6e0);
      auVar98 = vfmadd231ps_avx512vl(auVar105,local_3e0,auVar104);
      auVar187._8_4_ = 0x7fffffff;
      auVar187._0_8_ = 0x7fffffff7fffffff;
      auVar187._12_4_ = 0x7fffffff;
      auVar187._16_4_ = 0x7fffffff;
      auVar187._20_4_ = 0x7fffffff;
      auVar187._24_4_ = 0x7fffffff;
      auVar187._28_4_ = 0x7fffffff;
      auVar104 = vandps_avx(auVar89,auVar187);
      auVar105 = vandps_avx(auVar101,auVar187);
      auVar105 = vmaxps_avx(auVar104,auVar105);
      auVar104 = vandps_avx(auVar88,auVar187);
      auVar104 = vmaxps_avx(auVar105,auVar104);
      auVar88 = vbroadcastss_avx512vl(auVar83);
      uVar69 = vcmpps_avx512vl(auVar104,auVar88,1);
      bVar70 = (bool)((byte)uVar69 & 1);
      auVar99._0_4_ = (float)((uint)bVar70 * auVar94._0_4_ | (uint)!bVar70 * auVar89._0_4_);
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar99._4_4_ = (float)((uint)bVar70 * auVar94._4_4_ | (uint)!bVar70 * auVar89._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar99._8_4_ = (float)((uint)bVar70 * auVar94._8_4_ | (uint)!bVar70 * auVar89._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar99._12_4_ = (float)((uint)bVar70 * auVar94._12_4_ | (uint)!bVar70 * auVar89._12_4_);
      bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar99._16_4_ = (float)((uint)bVar70 * auVar94._16_4_ | (uint)!bVar70 * auVar89._16_4_);
      bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar99._20_4_ = (float)((uint)bVar70 * auVar94._20_4_ | (uint)!bVar70 * auVar89._20_4_);
      bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar99._24_4_ = (float)((uint)bVar70 * auVar94._24_4_ | (uint)!bVar70 * auVar89._24_4_);
      bVar70 = SUB81(uVar69 >> 7,0);
      auVar99._28_4_ = (uint)bVar70 * auVar94._28_4_ | (uint)!bVar70 * auVar89._28_4_;
      bVar70 = (bool)((byte)uVar69 & 1);
      auVar106._0_4_ = (float)((uint)bVar70 * auVar95._0_4_ | (uint)!bVar70 * auVar101._0_4_);
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar70 * auVar95._4_4_ | (uint)!bVar70 * auVar101._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar70 * auVar95._8_4_ | (uint)!bVar70 * auVar101._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar70 * auVar95._12_4_ | (uint)!bVar70 * auVar101._12_4_);
      bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar70 * auVar95._16_4_ | (uint)!bVar70 * auVar101._16_4_);
      bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar70 * auVar95._20_4_ | (uint)!bVar70 * auVar101._20_4_);
      bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar70 * auVar95._24_4_ | (uint)!bVar70 * auVar101._24_4_);
      bVar70 = SUB81(uVar69 >> 7,0);
      auVar106._28_4_ = (uint)bVar70 * auVar95._28_4_ | (uint)!bVar70 * auVar101._28_4_;
      auVar104 = vandps_avx(auVar187,auVar103);
      auVar105 = vandps_avx(auVar102,auVar187);
      auVar105 = vmaxps_avx(auVar104,auVar105);
      auVar104 = vandps_avx(auVar98,auVar187);
      auVar104 = vmaxps_avx(auVar105,auVar104);
      uVar69 = vcmpps_avx512vl(auVar104,auVar88,1);
      bVar70 = (bool)((byte)uVar69 & 1);
      auVar107._0_4_ = (float)((uint)bVar70 * auVar94._0_4_ | (uint)!bVar70 * auVar103._0_4_);
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar70 * auVar94._4_4_ | (uint)!bVar70 * auVar103._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar70 * auVar94._8_4_ | (uint)!bVar70 * auVar103._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar70 * auVar94._12_4_ | (uint)!bVar70 * auVar103._12_4_);
      bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar107._16_4_ = (float)((uint)bVar70 * auVar94._16_4_ | (uint)!bVar70 * auVar103._16_4_);
      bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar107._20_4_ = (float)((uint)bVar70 * auVar94._20_4_ | (uint)!bVar70 * auVar103._20_4_);
      bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar107._24_4_ = (float)((uint)bVar70 * auVar94._24_4_ | (uint)!bVar70 * auVar103._24_4_);
      bVar70 = SUB81(uVar69 >> 7,0);
      auVar107._28_4_ = (uint)bVar70 * auVar94._28_4_ | (uint)!bVar70 * auVar103._28_4_;
      bVar70 = (bool)((byte)uVar69 & 1);
      auVar94._0_4_ = (float)((uint)bVar70 * auVar95._0_4_ | (uint)!bVar70 * auVar102._0_4_);
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar94._4_4_ = (float)((uint)bVar70 * auVar95._4_4_ | (uint)!bVar70 * auVar102._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar94._8_4_ = (float)((uint)bVar70 * auVar95._8_4_ | (uint)!bVar70 * auVar102._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar94._12_4_ = (float)((uint)bVar70 * auVar95._12_4_ | (uint)!bVar70 * auVar102._12_4_);
      bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar94._16_4_ = (float)((uint)bVar70 * auVar95._16_4_ | (uint)!bVar70 * auVar102._16_4_);
      bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar94._20_4_ = (float)((uint)bVar70 * auVar95._20_4_ | (uint)!bVar70 * auVar102._20_4_);
      bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar94._24_4_ = (float)((uint)bVar70 * auVar95._24_4_ | (uint)!bVar70 * auVar102._24_4_);
      bVar70 = SUB81(uVar69 >> 7,0);
      auVar94._28_4_ = (uint)bVar70 * auVar95._28_4_ | (uint)!bVar70 * auVar102._28_4_;
      auVar87 = vxorps_avx512vl(auVar77,auVar77);
      auVar191 = ZEXT1664(auVar87);
      auVar104 = vfmadd213ps_avx512vl(auVar99,auVar99,ZEXT1632(auVar87));
      auVar77 = vfmadd231ps_fma(auVar104,auVar106,auVar106);
      auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
      fVar151 = auVar103._0_4_;
      fVar141 = auVar103._4_4_;
      fVar142 = auVar103._8_4_;
      fVar143 = auVar103._12_4_;
      fVar171 = auVar103._16_4_;
      fVar175 = auVar103._20_4_;
      fVar75 = auVar103._24_4_;
      auVar104._4_4_ = fVar141 * fVar141 * fVar141 * auVar77._4_4_ * -0.5;
      auVar104._0_4_ = fVar151 * fVar151 * fVar151 * auVar77._0_4_ * -0.5;
      auVar104._8_4_ = fVar142 * fVar142 * fVar142 * auVar77._8_4_ * -0.5;
      auVar104._12_4_ = fVar143 * fVar143 * fVar143 * auVar77._12_4_ * -0.5;
      auVar104._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
      auVar104._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
      auVar104._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
      auVar104._28_4_ = 0;
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar88,auVar103);
      auVar105._4_4_ = auVar106._4_4_ * auVar104._4_4_;
      auVar105._0_4_ = auVar106._0_4_ * auVar104._0_4_;
      auVar105._8_4_ = auVar106._8_4_ * auVar104._8_4_;
      auVar105._12_4_ = auVar106._12_4_ * auVar104._12_4_;
      auVar105._16_4_ = auVar106._16_4_ * auVar104._16_4_;
      auVar105._20_4_ = auVar106._20_4_ * auVar104._20_4_;
      auVar105._24_4_ = auVar106._24_4_ * auVar104._24_4_;
      auVar105._28_4_ = auVar103._28_4_;
      auVar103._4_4_ = auVar104._4_4_ * -auVar99._4_4_;
      auVar103._0_4_ = auVar104._0_4_ * -auVar99._0_4_;
      auVar103._8_4_ = auVar104._8_4_ * -auVar99._8_4_;
      auVar103._12_4_ = auVar104._12_4_ * -auVar99._12_4_;
      auVar103._16_4_ = auVar104._16_4_ * -auVar99._16_4_;
      auVar103._20_4_ = auVar104._20_4_ * -auVar99._20_4_;
      auVar103._24_4_ = auVar104._24_4_ * -auVar99._24_4_;
      auVar103._28_4_ = auVar99._28_4_ ^ 0x80000000;
      auVar95 = vmulps_avx512vl(auVar104,ZEXT1632(auVar87));
      auVar98 = ZEXT1632(auVar87);
      auVar102 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar98);
      auVar77 = vfmadd231ps_fma(auVar102,auVar94,auVar94);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
      fVar151 = auVar101._0_4_;
      fVar141 = auVar101._4_4_;
      fVar142 = auVar101._8_4_;
      fVar143 = auVar101._12_4_;
      fVar171 = auVar101._16_4_;
      fVar175 = auVar101._20_4_;
      fVar75 = auVar101._24_4_;
      auVar102._4_4_ = fVar141 * fVar141 * fVar141 * auVar77._4_4_ * -0.5;
      auVar102._0_4_ = fVar151 * fVar151 * fVar151 * auVar77._0_4_ * -0.5;
      auVar102._8_4_ = fVar142 * fVar142 * fVar142 * auVar77._8_4_ * -0.5;
      auVar102._12_4_ = fVar143 * fVar143 * fVar143 * auVar77._12_4_ * -0.5;
      auVar102._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
      auVar102._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
      auVar102._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
      auVar102._28_4_ = 0;
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar88,auVar101);
      auVar89._4_4_ = auVar94._4_4_ * auVar102._4_4_;
      auVar89._0_4_ = auVar94._0_4_ * auVar102._0_4_;
      auVar89._8_4_ = auVar94._8_4_ * auVar102._8_4_;
      auVar89._12_4_ = auVar94._12_4_ * auVar102._12_4_;
      auVar89._16_4_ = auVar94._16_4_ * auVar102._16_4_;
      auVar89._20_4_ = auVar94._20_4_ * auVar102._20_4_;
      auVar89._24_4_ = auVar94._24_4_ * auVar102._24_4_;
      auVar89._28_4_ = auVar101._28_4_;
      auVar101._4_4_ = -auVar107._4_4_ * auVar102._4_4_;
      auVar101._0_4_ = -auVar107._0_4_ * auVar102._0_4_;
      auVar101._8_4_ = -auVar107._8_4_ * auVar102._8_4_;
      auVar101._12_4_ = -auVar107._12_4_ * auVar102._12_4_;
      auVar101._16_4_ = -auVar107._16_4_ * auVar102._16_4_;
      auVar101._20_4_ = -auVar107._20_4_ * auVar102._20_4_;
      auVar101._24_4_ = -auVar107._24_4_ * auVar102._24_4_;
      auVar101._28_4_ = auVar104._28_4_;
      auVar104 = vmulps_avx512vl(auVar102,auVar98);
      auVar77 = vfmadd213ps_fma(auVar105,auVar97,auVar90);
      auVar29 = vfmadd213ps_fma(auVar103,auVar97,auVar91);
      auVar102 = vfmadd213ps_avx512vl(auVar95,auVar97,auVar96);
      auVar88 = vfmadd213ps_avx512vl(auVar89,ZEXT1632(auVar79),auVar92);
      auVar86 = vfnmadd213ps_fma(auVar105,auVar97,auVar90);
      auVar90 = ZEXT1632(auVar79);
      auVar85 = vfmadd213ps_fma(auVar101,auVar90,auVar93);
      auVar136 = vfnmadd213ps_fma(auVar103,auVar97,auVar91);
      auVar80 = vfmadd213ps_fma(auVar104,auVar90,auVar100);
      auVar105 = vfnmadd231ps_avx512vl(auVar96,auVar97,auVar95);
      auVar137 = vfnmadd213ps_fma(auVar89,auVar90,auVar92);
      auVar145 = vfnmadd213ps_fma(auVar101,auVar90,auVar93);
      auVar146 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar79),auVar104);
      auVar103 = vsubps_avx512vl(auVar88,ZEXT1632(auVar86));
      auVar104 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar136));
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar80),auVar105);
      auVar101 = vmulps_avx512vl(auVar104,auVar105);
      auVar82 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar136),auVar89);
      auVar100._4_4_ = auVar86._4_4_ * auVar89._4_4_;
      auVar100._0_4_ = auVar86._0_4_ * auVar89._0_4_;
      auVar100._8_4_ = auVar86._8_4_ * auVar89._8_4_;
      auVar100._12_4_ = auVar86._12_4_ * auVar89._12_4_;
      auVar100._16_4_ = auVar89._16_4_ * 0.0;
      auVar100._20_4_ = auVar89._20_4_ * 0.0;
      auVar100._24_4_ = auVar89._24_4_ * 0.0;
      auVar100._28_4_ = auVar89._28_4_;
      auVar89 = vfmsub231ps_avx512vl(auVar100,auVar105,auVar103);
      auVar90._4_4_ = auVar136._4_4_ * auVar103._4_4_;
      auVar90._0_4_ = auVar136._0_4_ * auVar103._0_4_;
      auVar90._8_4_ = auVar136._8_4_ * auVar103._8_4_;
      auVar90._12_4_ = auVar136._12_4_ * auVar103._12_4_;
      auVar90._16_4_ = auVar103._16_4_ * 0.0;
      auVar90._20_4_ = auVar103._20_4_ * 0.0;
      auVar90._24_4_ = auVar103._24_4_ * 0.0;
      auVar90._28_4_ = auVar103._28_4_;
      auVar81 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar86),auVar104);
      auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar98,auVar89);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar98,ZEXT1632(auVar82));
      auVar94 = ZEXT1632(auVar87);
      uVar69 = vcmpps_avx512vl(auVar104,auVar94,2);
      bVar66 = (byte)uVar69;
      fVar75 = (float)((uint)(bVar66 & 1) * auVar77._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar137._0_4_);
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar126 = (float)((uint)bVar70 * auVar77._4_4_ | (uint)!bVar70 * auVar137._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar128 = (float)((uint)bVar70 * auVar77._8_4_ | (uint)!bVar70 * auVar137._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar131 = (float)((uint)bVar70 * auVar77._12_4_ | (uint)!bVar70 * auVar137._12_4_);
      auVar101 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar128,CONCAT44(fVar126,fVar75))));
      fVar76 = (float)((uint)(bVar66 & 1) * auVar29._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar145._0_4_);
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar127 = (float)((uint)bVar70 * auVar29._4_4_ | (uint)!bVar70 * auVar145._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar129 = (float)((uint)bVar70 * auVar29._8_4_ | (uint)!bVar70 * auVar145._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar132 = (float)((uint)bVar70 * auVar29._12_4_ | (uint)!bVar70 * auVar145._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar129,CONCAT44(fVar127,fVar76))));
      auVar95._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar146._0_4_)
      ;
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar95._4_4_ = (float)((uint)bVar70 * auVar102._4_4_ | (uint)!bVar70 * auVar146._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar95._8_4_ = (float)((uint)bVar70 * auVar102._8_4_ | (uint)!bVar70 * auVar146._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar95._12_4_ = (float)((uint)bVar70 * auVar102._12_4_ | (uint)!bVar70 * auVar146._12_4_);
      fVar151 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar102._16_4_);
      auVar95._16_4_ = fVar151;
      fVar141 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar102._20_4_);
      auVar95._20_4_ = fVar141;
      fVar142 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar102._24_4_);
      auVar95._24_4_ = fVar142;
      iVar1 = (uint)(byte)(uVar69 >> 7) * auVar102._28_4_;
      auVar95._28_4_ = iVar1;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar88);
      auVar108._0_4_ =
           (uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar29._0_4_;
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar70 * auVar103._4_4_ | (uint)!bVar70 * auVar29._4_4_;
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar70 * auVar103._8_4_ | (uint)!bVar70 * auVar29._8_4_;
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar70 * auVar103._12_4_ | (uint)!bVar70 * auVar29._12_4_;
      auVar108._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_;
      auVar108._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_;
      auVar108._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_;
      auVar108._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar136),ZEXT1632(auVar85));
      auVar109._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar82._0_4_);
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar70 * auVar103._4_4_ | (uint)!bVar70 * auVar82._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar70 * auVar103._8_4_ | (uint)!bVar70 * auVar82._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar70 * auVar103._12_4_ | (uint)!bVar70 * auVar82._12_4_);
      fVar143 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_);
      auVar109._16_4_ = fVar143;
      fVar171 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_);
      auVar109._20_4_ = fVar171;
      fVar175 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_);
      auVar109._24_4_ = fVar175;
      auVar109._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar80));
      auVar110._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar102._0_4_)
      ;
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar70 * auVar103._4_4_ | (uint)!bVar70 * auVar102._4_4_);
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar70 * auVar103._8_4_ | (uint)!bVar70 * auVar102._8_4_);
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar70 * auVar103._12_4_ | (uint)!bVar70 * auVar102._12_4_);
      bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar70 * auVar103._16_4_ | (uint)!bVar70 * auVar102._16_4_);
      bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar70 * auVar103._20_4_ | (uint)!bVar70 * auVar102._20_4_);
      bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar70 * auVar103._24_4_ | (uint)!bVar70 * auVar102._24_4_);
      bVar70 = SUB81(uVar69 >> 7,0);
      auVar110._28_4_ = (uint)bVar70 * auVar103._28_4_ | (uint)!bVar70 * auVar102._28_4_;
      auVar111._0_4_ =
           (uint)(bVar66 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar88._0_4_;
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar70 * (int)auVar86._4_4_ | (uint)!bVar70 * auVar88._4_4_;
      bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar70 * (int)auVar86._8_4_ | (uint)!bVar70 * auVar88._8_4_;
      bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar70 * (int)auVar86._12_4_ | (uint)!bVar70 * auVar88._12_4_;
      auVar111._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar88._16_4_;
      auVar111._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar88._20_4_;
      auVar111._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar88._24_4_;
      auVar111._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar88._28_4_;
      bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar112._0_4_ =
           (uint)(bVar66 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar80._0_4_;
      bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar80._4_4_;
      bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar80._8_4_;
      bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar80._12_4_;
      auVar112._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_;
      auVar112._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_;
      auVar112._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_;
      iVar2 = (uint)(byte)(uVar69 >> 7) * auVar105._28_4_;
      auVar112._28_4_ = iVar2;
      auVar90 = vsubps_avx512vl(auVar111,auVar101);
      auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar136._12_4_ |
                                               (uint)!bVar14 * auVar85._12_4_,
                                               CONCAT48((uint)bVar13 * (int)auVar136._8_4_ |
                                                        (uint)!bVar13 * auVar85._8_4_,
                                                        CONCAT44((uint)bVar70 * (int)auVar136._4_4_
                                                                 | (uint)!bVar70 * auVar85._4_4_,
                                                                 (uint)(bVar66 & 1) *
                                                                 (int)auVar136._0_4_ |
                                                                 (uint)!(bool)(bVar66 & 1) *
                                                                 auVar85._0_4_)))),auVar100);
      auVar103 = vsubps_avx(auVar112,auVar95);
      auVar102 = vsubps_avx(auVar101,auVar108);
      auVar88 = vsubps_avx(auVar100,auVar109);
      auVar89 = vsubps_avx(auVar95,auVar110);
      auVar91._4_4_ = auVar103._4_4_ * fVar126;
      auVar91._0_4_ = auVar103._0_4_ * fVar75;
      auVar91._8_4_ = auVar103._8_4_ * fVar128;
      auVar91._12_4_ = auVar103._12_4_ * fVar131;
      auVar91._16_4_ = auVar103._16_4_ * 0.0;
      auVar91._20_4_ = auVar103._20_4_ * 0.0;
      auVar91._24_4_ = auVar103._24_4_ * 0.0;
      auVar91._28_4_ = iVar2;
      auVar77 = vfmsub231ps_fma(auVar91,auVar95,auVar90);
      auVar92._4_4_ = fVar127 * auVar90._4_4_;
      auVar92._0_4_ = fVar76 * auVar90._0_4_;
      auVar92._8_4_ = fVar129 * auVar90._8_4_;
      auVar92._12_4_ = fVar132 * auVar90._12_4_;
      auVar92._16_4_ = auVar90._16_4_ * 0.0;
      auVar92._20_4_ = auVar90._20_4_ * 0.0;
      auVar92._24_4_ = auVar90._24_4_ * 0.0;
      auVar92._28_4_ = auVar104._28_4_;
      auVar29 = vfmsub231ps_fma(auVar92,auVar101,auVar105);
      auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar94,ZEXT1632(auVar77));
      auVar164._0_4_ = auVar105._0_4_ * auVar95._0_4_;
      auVar164._4_4_ = auVar105._4_4_ * auVar95._4_4_;
      auVar164._8_4_ = auVar105._8_4_ * auVar95._8_4_;
      auVar164._12_4_ = auVar105._12_4_ * auVar95._12_4_;
      auVar164._16_4_ = auVar105._16_4_ * fVar151;
      auVar164._20_4_ = auVar105._20_4_ * fVar141;
      auVar164._24_4_ = auVar105._24_4_ * fVar142;
      auVar164._28_4_ = 0;
      auVar77 = vfmsub231ps_fma(auVar164,auVar100,auVar103);
      auVar91 = vfmadd231ps_avx512vl(auVar104,auVar94,ZEXT1632(auVar77));
      auVar104 = vmulps_avx512vl(auVar89,auVar108);
      auVar104 = vfmsub231ps_avx512vl(auVar104,auVar102,auVar110);
      auVar93._4_4_ = auVar88._4_4_ * auVar110._4_4_;
      auVar93._0_4_ = auVar88._0_4_ * auVar110._0_4_;
      auVar93._8_4_ = auVar88._8_4_ * auVar110._8_4_;
      auVar93._12_4_ = auVar88._12_4_ * auVar110._12_4_;
      auVar93._16_4_ = auVar88._16_4_ * auVar110._16_4_;
      auVar93._20_4_ = auVar88._20_4_ * auVar110._20_4_;
      auVar93._24_4_ = auVar88._24_4_ * auVar110._24_4_;
      auVar93._28_4_ = auVar110._28_4_;
      auVar77 = vfmsub231ps_fma(auVar93,auVar109,auVar89);
      auVar165._0_4_ = auVar109._0_4_ * auVar102._0_4_;
      auVar165._4_4_ = auVar109._4_4_ * auVar102._4_4_;
      auVar165._8_4_ = auVar109._8_4_ * auVar102._8_4_;
      auVar165._12_4_ = auVar109._12_4_ * auVar102._12_4_;
      auVar165._16_4_ = fVar143 * auVar102._16_4_;
      auVar165._20_4_ = fVar171 * auVar102._20_4_;
      auVar165._24_4_ = fVar175 * auVar102._24_4_;
      auVar165._28_4_ = 0;
      auVar29 = vfmsub231ps_fma(auVar165,auVar88,auVar108);
      auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar94,auVar104);
      auVar92 = vfmadd231ps_avx512vl(auVar104,auVar94,ZEXT1632(auVar77));
      auVar104 = vmaxps_avx(auVar91,auVar92);
      uVar144 = vcmpps_avx512vl(auVar104,auVar94,2);
      bVar74 = bVar74 & (byte)uVar144;
      auVar192 = ZEXT3264(local_700);
      auVar193 = ZEXT3264(local_6e0);
      auVar189 = ZEXT3264(local_820);
      auVar140 = ZEXT3264(local_800);
      if (bVar74 == 0) {
        bVar70 = false;
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar104);
        auVar194 = ZEXT3264(local_7a0);
        auVar196 = ZEXT3264(local_7c0);
        auVar197 = ZEXT3264(local_7e0);
      }
      else {
        auVar39._4_4_ = auVar89._4_4_ * auVar105._4_4_;
        auVar39._0_4_ = auVar89._0_4_ * auVar105._0_4_;
        auVar39._8_4_ = auVar89._8_4_ * auVar105._8_4_;
        auVar39._12_4_ = auVar89._12_4_ * auVar105._12_4_;
        auVar39._16_4_ = auVar89._16_4_ * auVar105._16_4_;
        auVar39._20_4_ = auVar89._20_4_ * auVar105._20_4_;
        auVar39._24_4_ = auVar89._24_4_ * auVar105._24_4_;
        auVar39._28_4_ = auVar104._28_4_;
        auVar85 = vfmsub231ps_fma(auVar39,auVar88,auVar103);
        auVar40._4_4_ = auVar103._4_4_ * auVar102._4_4_;
        auVar40._0_4_ = auVar103._0_4_ * auVar102._0_4_;
        auVar40._8_4_ = auVar103._8_4_ * auVar102._8_4_;
        auVar40._12_4_ = auVar103._12_4_ * auVar102._12_4_;
        auVar40._16_4_ = auVar103._16_4_ * auVar102._16_4_;
        auVar40._20_4_ = auVar103._20_4_ * auVar102._20_4_;
        auVar40._24_4_ = auVar103._24_4_ * auVar102._24_4_;
        auVar40._28_4_ = auVar103._28_4_;
        auVar29 = vfmsub231ps_fma(auVar40,auVar90,auVar89);
        auVar41._4_4_ = auVar88._4_4_ * auVar90._4_4_;
        auVar41._0_4_ = auVar88._0_4_ * auVar90._0_4_;
        auVar41._8_4_ = auVar88._8_4_ * auVar90._8_4_;
        auVar41._12_4_ = auVar88._12_4_ * auVar90._12_4_;
        auVar41._16_4_ = auVar88._16_4_ * auVar90._16_4_;
        auVar41._20_4_ = auVar88._20_4_ * auVar90._20_4_;
        auVar41._24_4_ = auVar88._24_4_ * auVar90._24_4_;
        auVar41._28_4_ = auVar88._28_4_;
        auVar80 = vfmsub231ps_fma(auVar41,auVar102,auVar105);
        auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar29),ZEXT1632(auVar80));
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar85),auVar94);
        auVar105 = vrcp14ps_avx512vl(auVar104);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar103);
        auVar102 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar103);
        auVar77 = vfmadd132ps_fma(auVar102,auVar105,auVar105);
        auVar42._4_4_ = auVar80._4_4_ * auVar95._4_4_;
        auVar42._0_4_ = auVar80._0_4_ * auVar95._0_4_;
        auVar42._8_4_ = auVar80._8_4_ * auVar95._8_4_;
        auVar42._12_4_ = auVar80._12_4_ * auVar95._12_4_;
        auVar42._16_4_ = fVar151 * 0.0;
        auVar42._20_4_ = fVar141 * 0.0;
        auVar42._24_4_ = fVar142 * 0.0;
        auVar42._28_4_ = iVar1;
        auVar29 = vfmadd231ps_fma(auVar42,auVar100,ZEXT1632(auVar29));
        auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar101,ZEXT1632(auVar85));
        fVar151 = auVar77._0_4_;
        fVar141 = auVar77._4_4_;
        fVar142 = auVar77._8_4_;
        fVar143 = auVar77._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar29._12_4_ * fVar143,
                                       CONCAT48(auVar29._8_4_ * fVar142,
                                                CONCAT44(auVar29._4_4_ * fVar141,
                                                         auVar29._0_4_ * fVar151))));
        auVar178._4_4_ = uVar182;
        auVar178._0_4_ = uVar182;
        auVar178._8_4_ = uVar182;
        auVar178._12_4_ = uVar182;
        auVar178._16_4_ = uVar182;
        auVar178._20_4_ = uVar182;
        auVar178._24_4_ = uVar182;
        auVar178._28_4_ = uVar182;
        uVar144 = vcmpps_avx512vl(auVar178,local_5a0,2);
        uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar135;
        auVar34._0_4_ = uVar135;
        auVar34._8_4_ = uVar135;
        auVar34._12_4_ = uVar135;
        auVar34._16_4_ = uVar135;
        auVar34._20_4_ = uVar135;
        auVar34._24_4_ = uVar135;
        auVar34._28_4_ = uVar135;
        uVar31 = vcmpps_avx512vl(local_5a0,auVar34,2);
        bVar74 = (byte)uVar144 & (byte)uVar31 & bVar74;
        auVar194 = ZEXT3264(local_7a0);
        auVar196 = ZEXT3264(local_7c0);
        auVar197 = ZEXT3264(local_7e0);
        if (bVar74 != 0) {
          uVar144 = vcmpps_avx512vl(auVar104,auVar94,4);
          bVar74 = bVar74 & (byte)uVar144;
          if (bVar74 != 0) {
            fVar171 = auVar91._0_4_ * fVar151;
            fVar175 = auVar91._4_4_ * fVar141;
            auVar43._4_4_ = fVar175;
            auVar43._0_4_ = fVar171;
            fVar75 = auVar91._8_4_ * fVar142;
            auVar43._8_4_ = fVar75;
            fVar76 = auVar91._12_4_ * fVar143;
            auVar43._12_4_ = fVar76;
            fVar126 = auVar91._16_4_ * 0.0;
            auVar43._16_4_ = fVar126;
            fVar127 = auVar91._20_4_ * 0.0;
            auVar43._20_4_ = fVar127;
            fVar128 = auVar91._24_4_ * 0.0;
            auVar43._24_4_ = fVar128;
            auVar43._28_4_ = auVar104._28_4_;
            auVar105 = vsubps_avx512vl(auVar103,auVar43);
            local_5e0._0_4_ =
                 (float)((uint)(bVar66 & 1) * (int)fVar171 |
                        (uint)!(bool)(bVar66 & 1) * auVar105._0_4_);
            bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar70 * (int)fVar175 | (uint)!bVar70 * auVar105._4_4_);
            bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar70 * (int)fVar75 | (uint)!bVar70 * auVar105._8_4_);
            bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar70 * (int)fVar76 | (uint)!bVar70 * auVar105._12_4_)
            ;
            bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar70 * (int)fVar126 | (uint)!bVar70 * auVar105._16_4_);
            bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar70 * (int)fVar127 | (uint)!bVar70 * auVar105._20_4_);
            bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar70 * (int)fVar128 | (uint)!bVar70 * auVar105._24_4_);
            bVar70 = SUB81(uVar69 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar70 * auVar104._28_4_ | (uint)!bVar70 * auVar105._28_4_);
            auVar104 = vsubps_avx(ZEXT1632(auVar79),auVar97);
            auVar77 = vfmadd213ps_fma(auVar104,local_5e0,auVar97);
            uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar97._4_4_ = uVar135;
            auVar97._0_4_ = uVar135;
            auVar97._8_4_ = uVar135;
            auVar97._12_4_ = uVar135;
            auVar97._16_4_ = uVar135;
            auVar97._20_4_ = uVar135;
            auVar97._24_4_ = uVar135;
            auVar97._28_4_ = uVar135;
            auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                          CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                   CONCAT44(auVar77._4_4_ +
                                                                            auVar77._4_4_,
                                                                            auVar77._0_4_ +
                                                                            auVar77._0_4_)))),
                                       auVar97);
            uVar144 = vcmpps_avx512vl(local_5a0,auVar104,6);
            if (((byte)uVar144 & bVar74) != 0) {
              auVar150._0_4_ = auVar92._0_4_ * fVar151;
              auVar150._4_4_ = auVar92._4_4_ * fVar141;
              auVar150._8_4_ = auVar92._8_4_ * fVar142;
              auVar150._12_4_ = auVar92._12_4_ * fVar143;
              auVar150._16_4_ = auVar92._16_4_ * 0.0;
              auVar150._20_4_ = auVar92._20_4_ * 0.0;
              auVar150._24_4_ = auVar92._24_4_ * 0.0;
              auVar150._28_4_ = 0;
              auVar104 = vsubps_avx512vl(auVar103,auVar150);
              auVar113._0_4_ =
                   (uint)(bVar66 & 1) * (int)auVar150._0_4_ |
                   (uint)!(bool)(bVar66 & 1) * auVar104._0_4_;
              bVar70 = (bool)((byte)(uVar69 >> 1) & 1);
              auVar113._4_4_ = (uint)bVar70 * (int)auVar150._4_4_ | (uint)!bVar70 * auVar104._4_4_;
              bVar70 = (bool)((byte)(uVar69 >> 2) & 1);
              auVar113._8_4_ = (uint)bVar70 * (int)auVar150._8_4_ | (uint)!bVar70 * auVar104._8_4_;
              bVar70 = (bool)((byte)(uVar69 >> 3) & 1);
              auVar113._12_4_ =
                   (uint)bVar70 * (int)auVar150._12_4_ | (uint)!bVar70 * auVar104._12_4_;
              bVar70 = (bool)((byte)(uVar69 >> 4) & 1);
              auVar113._16_4_ =
                   (uint)bVar70 * (int)auVar150._16_4_ | (uint)!bVar70 * auVar104._16_4_;
              bVar70 = (bool)((byte)(uVar69 >> 5) & 1);
              auVar113._20_4_ =
                   (uint)bVar70 * (int)auVar150._20_4_ | (uint)!bVar70 * auVar104._20_4_;
              bVar70 = (bool)((byte)(uVar69 >> 6) & 1);
              auVar113._24_4_ =
                   (uint)bVar70 * (int)auVar150._24_4_ | (uint)!bVar70 * auVar104._24_4_;
              auVar113._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar104._28_4_;
              auVar35._8_4_ = 0x40000000;
              auVar35._0_8_ = 0x4000000040000000;
              auVar35._12_4_ = 0x40000000;
              auVar35._16_4_ = 0x40000000;
              auVar35._20_4_ = 0x40000000;
              auVar35._24_4_ = 0x40000000;
              auVar35._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar113,auVar103,auVar35);
              local_580 = 0;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar70 = true, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_0180c67b;
                fVar151 = 1.0 / (float)local_480._0_4_;
                local_520[0] = fVar151 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar151 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar151 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar151 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar151 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar151 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar151 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                lVar67 = 0;
                local_6a0 = (ulong)((byte)uVar144 & bVar74);
                for (uVar69 = local_6a0; (uVar69 & 1) == 0;
                    uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                  lVar67 = lVar67 + 1;
                }
                auVar124 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar124);
                local_57c = iVar9;
                local_570 = auVar84;
                local_560 = uVar30;
                uStack_558 = uVar32;
                local_550 = uVar62;
                uStack_548 = uVar63;
                while( true ) {
                  auVar83 = auVar198._0_16_;
                  auVar77 = auVar191._0_16_;
                  if (local_6a0 == 0) break;
                  uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[lVar67]));
                  local_620 = (uint)lVar67;
                  uStack_61c = (uint)((ulong)lVar67 >> 0x20);
                  local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + lVar67 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + lVar67 * 4);
                  local_850.context = context->user;
                  fVar141 = local_200._0_4_;
                  fVar151 = 1.0 - fVar141;
                  auVar85 = vfnmadd231ss_fma(ZEXT416((uint)(fVar141 * (fVar151 + fVar151))),
                                             ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                  auVar79 = local_200._0_16_;
                  auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                            ZEXT416(0xc0a00000));
                  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * 3.0)),
                                            ZEXT416((uint)(fVar141 + fVar141)),auVar83);
                  auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                            ZEXT416(0x40000000));
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                            ZEXT416((uint)(fVar151 + fVar151)),auVar83);
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),auVar79,
                                            ZEXT416((uint)(fVar151 * -2.0)));
                  fVar151 = auVar85._0_4_ * 0.5;
                  fVar141 = auVar29._0_4_ * 0.5;
                  fVar142 = auVar83._0_4_ * 0.5;
                  fVar143 = auVar79._0_4_ * 0.5;
                  auVar157._0_4_ = fVar143 * local_760;
                  auVar157._4_4_ = fVar143 * fStack_75c;
                  auVar157._8_4_ = fVar143 * fStack_758;
                  auVar157._12_4_ = fVar143 * fStack_754;
                  auVar169._4_4_ = fVar142;
                  auVar169._0_4_ = fVar142;
                  auVar169._8_4_ = fVar142;
                  auVar169._12_4_ = fVar142;
                  auVar83 = vfmadd132ps_fma(auVar169,auVar157,auVar147);
                  auVar158._4_4_ = fVar141;
                  auVar158._0_4_ = fVar141;
                  auVar158._8_4_ = fVar141;
                  auVar158._12_4_ = fVar141;
                  auVar83 = vfmadd132ps_fma(auVar158,auVar83,auVar27);
                  auVar138._4_4_ = fVar151;
                  auVar138._0_4_ = fVar151;
                  auVar138._8_4_ = fVar151;
                  auVar138._12_4_ = fVar151;
                  auVar83 = vfmadd213ps_fma(auVar138,auVar84,auVar83);
                  auVar124 = vbroadcastss_avx512f(auVar83);
                  auVar125 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar125,ZEXT1664(auVar83));
                  auVar125 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar125,ZEXT1664(auVar83));
                  local_2c0[0] = (RTCHitN)auVar124[0];
                  local_2c0[1] = (RTCHitN)auVar124[1];
                  local_2c0[2] = (RTCHitN)auVar124[2];
                  local_2c0[3] = (RTCHitN)auVar124[3];
                  local_2c0[4] = (RTCHitN)auVar124[4];
                  local_2c0[5] = (RTCHitN)auVar124[5];
                  local_2c0[6] = (RTCHitN)auVar124[6];
                  local_2c0[7] = (RTCHitN)auVar124[7];
                  local_2c0[8] = (RTCHitN)auVar124[8];
                  local_2c0[9] = (RTCHitN)auVar124[9];
                  local_2c0[10] = (RTCHitN)auVar124[10];
                  local_2c0[0xb] = (RTCHitN)auVar124[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar124[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar124[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar124[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar124[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar124[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar124[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar124[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar124[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar124[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar124[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar124[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar124[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar124[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar124[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar124[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar124[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar124[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar124[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar124[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar124[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar124[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar124[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar124[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar124[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar124[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar124[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar124[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar124[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar124[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar124[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar124[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar124[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar124[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar124[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar124[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar124[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar124[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar124[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar124[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar124[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar124[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar124[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar124[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar124[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar124[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar124[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar124[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar124[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar124[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar124[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar124[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar124[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar124 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar124);
                  vpcmpeqd_avx2(auVar124._0_32_,auVar124._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]));
                  auVar124 = vmovdqa64_avx512f(local_340);
                  local_680 = vmovdqa64_avx512f(auVar124);
                  local_850.valid = (int *)local_680;
                  local_850.geometryUserPtr = pGVar10->userPtr;
                  local_850.hit = local_2c0;
                  local_850.N = 0x10;
                  local_850.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_850);
                    auVar198 = ZEXT1664(local_6c0._0_16_);
                    auVar197 = ZEXT3264(local_7e0);
                    auVar196 = ZEXT3264(local_7c0);
                    auVar195 = ZEXT3264(local_720);
                    auVar194 = ZEXT3264(local_7a0);
                    auVar140 = ZEXT3264(local_800);
                    auVar189 = ZEXT3264(local_820);
                    auVar193 = ZEXT3264(local_6e0);
                    auVar192 = ZEXT3264(local_700);
                    auVar83 = vxorps_avx512vl(auVar77,auVar77);
                    auVar191 = ZEXT1664(auVar83);
                    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar190 = ZEXT3264(auVar104);
                    auVar124 = vmovdqa64_avx512f(local_680);
                    uVar182 = local_740._0_4_;
                  }
                  auVar83 = auVar191._0_16_;
                  uVar144 = vptestmd_avx512f(auVar124,auVar124);
                  if ((short)uVar144 != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_850);
                      auVar198 = ZEXT1664(local_6c0._0_16_);
                      auVar197 = ZEXT3264(local_7e0);
                      auVar196 = ZEXT3264(local_7c0);
                      auVar195 = ZEXT3264(local_720);
                      auVar194 = ZEXT3264(local_7a0);
                      auVar140 = ZEXT3264(local_800);
                      auVar189 = ZEXT3264(local_820);
                      auVar193 = ZEXT3264(local_6e0);
                      auVar192 = ZEXT3264(local_700);
                      auVar83 = vxorps_avx512vl(auVar83,auVar83);
                      auVar191 = ZEXT1664(auVar83);
                      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar190 = ZEXT3264(auVar104);
                      auVar124 = vmovdqa64_avx512f(local_680);
                      uVar182 = local_740._0_4_;
                    }
                    auVar83 = auVar198._0_16_;
                    uVar69 = vptestmd_avx512f(auVar124,auVar124);
                    auVar124 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar70 = (bool)((byte)uVar69 & 1);
                    bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                    bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                    bVar18 = (bool)((byte)(uVar69 >> 7) & 1);
                    bVar19 = (bool)((byte)(uVar69 >> 8) & 1);
                    bVar20 = (bool)((byte)(uVar69 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar69 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar69 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar69 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar69 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar69 >> 0xe) & 1);
                    bVar26 = SUB81(uVar69 >> 0xf,0);
                    *(uint *)(local_850.ray + 0x200) =
                         (uint)bVar70 * auVar124._0_4_ |
                         (uint)!bVar70 * *(int *)(local_850.ray + 0x200);
                    *(uint *)(local_850.ray + 0x204) =
                         (uint)bVar12 * auVar124._4_4_ |
                         (uint)!bVar12 * *(int *)(local_850.ray + 0x204);
                    *(uint *)(local_850.ray + 0x208) =
                         (uint)bVar13 * auVar124._8_4_ |
                         (uint)!bVar13 * *(int *)(local_850.ray + 0x208);
                    *(uint *)(local_850.ray + 0x20c) =
                         (uint)bVar14 * auVar124._12_4_ |
                         (uint)!bVar14 * *(int *)(local_850.ray + 0x20c);
                    *(uint *)(local_850.ray + 0x210) =
                         (uint)bVar15 * auVar124._16_4_ |
                         (uint)!bVar15 * *(int *)(local_850.ray + 0x210);
                    *(uint *)(local_850.ray + 0x214) =
                         (uint)bVar16 * auVar124._20_4_ |
                         (uint)!bVar16 * *(int *)(local_850.ray + 0x214);
                    *(uint *)(local_850.ray + 0x218) =
                         (uint)bVar17 * auVar124._24_4_ |
                         (uint)!bVar17 * *(int *)(local_850.ray + 0x218);
                    *(uint *)(local_850.ray + 0x21c) =
                         (uint)bVar18 * auVar124._28_4_ |
                         (uint)!bVar18 * *(int *)(local_850.ray + 0x21c);
                    *(uint *)(local_850.ray + 0x220) =
                         (uint)bVar19 * auVar124._32_4_ |
                         (uint)!bVar19 * *(int *)(local_850.ray + 0x220);
                    *(uint *)(local_850.ray + 0x224) =
                         (uint)bVar20 * auVar124._36_4_ |
                         (uint)!bVar20 * *(int *)(local_850.ray + 0x224);
                    *(uint *)(local_850.ray + 0x228) =
                         (uint)bVar21 * auVar124._40_4_ |
                         (uint)!bVar21 * *(int *)(local_850.ray + 0x228);
                    *(uint *)(local_850.ray + 0x22c) =
                         (uint)bVar22 * auVar124._44_4_ |
                         (uint)!bVar22 * *(int *)(local_850.ray + 0x22c);
                    *(uint *)(local_850.ray + 0x230) =
                         (uint)bVar23 * auVar124._48_4_ |
                         (uint)!bVar23 * *(int *)(local_850.ray + 0x230);
                    *(uint *)(local_850.ray + 0x234) =
                         (uint)bVar24 * auVar124._52_4_ |
                         (uint)!bVar24 * *(int *)(local_850.ray + 0x234);
                    *(uint *)(local_850.ray + 0x238) =
                         (uint)bVar25 * auVar124._56_4_ |
                         (uint)!bVar25 * *(int *)(local_850.ray + 0x238);
                    *(uint *)(local_850.ray + 0x23c) =
                         (uint)bVar26 * auVar124._60_4_ |
                         (uint)!bVar26 * *(int *)(local_850.ray + 0x23c);
                    if ((short)uVar69 != 0) {
                      bVar70 = true;
                      goto LAB_0180c67b;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar135;
                  lVar67 = 0;
                  local_6a0 = local_6a0 ^ 1L << ((ulong)local_620 & 0x3f);
                  for (uVar69 = local_6a0; (uVar69 & 1) == 0;
                      uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                    lVar67 = lVar67 + 1;
                  }
                }
              }
            }
          }
        }
        bVar70 = false;
      }
    }
LAB_0180c67b:
    if (8 < iVar9) {
      local_6c0 = vpbroadcastd_avx512vl();
      local_740 = vbroadcastss_avx512vl(auVar83);
      fStack_698 = 1.0 / (float)local_480._0_4_;
      auVar198 = vpbroadcastd_avx512f();
      local_480 = vmovdqa64_avx512f(auVar198);
      local_800 = auVar140._0_32_;
      fStack_694 = fStack_698;
      fStack_690 = fStack_698;
      fStack_68c = fStack_698;
      fStack_688 = fStack_698;
      fStack_684 = fStack_698;
      local_620 = uVar182;
      uStack_61c = uVar182;
      uStack_618 = uVar182;
      uStack_614 = uVar182;
      uStack_610 = uVar182;
      uStack_60c = uVar182;
      uStack_608 = uVar182;
      uStack_604 = uVar182;
      local_6a0._0_4_ = fStack_698;
      local_6a0._4_4_ = fStack_698;
      for (lVar67 = 8; lVar67 < iVar9; lVar67 = lVar67 + 8) {
        auVar104 = vpbroadcastd_avx512vl();
        auVar88 = vpor_avx2(auVar104,_DAT_01fb4ba0);
        uVar31 = vpcmpd_avx512vl(auVar88,local_6c0,1);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar67 * 4 + lVar72);
        auVar105 = *(undefined1 (*) [32])(lVar72 + 0x22047f0 + lVar67 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar72 + 0x2204c74 + lVar67 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar72 + 0x22050f8 + lVar67 * 4);
        local_7c0 = auVar196._0_32_;
        auVar89 = vmulps_avx512vl(local_7c0,auVar102);
        local_7e0 = auVar197._0_32_;
        auVar101 = vmulps_avx512vl(local_7e0,auVar102);
        auVar44._4_4_ = auVar102._4_4_ * (float)local_3c0._4_4_;
        auVar44._0_4_ = auVar102._0_4_ * (float)local_3c0._0_4_;
        auVar44._8_4_ = auVar102._8_4_ * fStack_3b8;
        auVar44._12_4_ = auVar102._12_4_ * fStack_3b4;
        auVar44._16_4_ = auVar102._16_4_ * fStack_3b0;
        auVar44._20_4_ = auVar102._20_4_ * fStack_3ac;
        auVar44._24_4_ = auVar102._24_4_ * fStack_3a8;
        auVar44._28_4_ = auVar88._28_4_;
        local_7a0 = auVar194._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar89,auVar103,local_7a0);
        auVar108 = auVar195._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar108);
        auVar101 = vfmadd231ps_avx512vl(auVar44,auVar103,local_3a0);
        auVar106 = auVar189._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar105,auVar106);
        auVar99 = auVar140._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar105,auVar99);
        auVar83 = vfmadd231ps_fma(auVar101,auVar105,local_380);
        auVar107 = auVar192._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar104,auVar107);
        local_6e0 = auVar193._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar89,auVar104,local_6e0);
        auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar67 * 4 + lVar72);
        auVar89 = *(undefined1 (*) [32])(lVar72 + 0x2206c10 + lVar67 * 4);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar104,local_360);
        auVar101 = *(undefined1 (*) [32])(lVar72 + 0x2207094 + lVar67 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar72 + 0x2207518 + lVar67 * 4);
        auVar90 = vmulps_avx512vl(local_7c0,auVar100);
        auVar91 = vmulps_avx512vl(local_7e0,auVar100);
        auVar45._4_4_ = auVar100._4_4_ * (float)local_3c0._4_4_;
        auVar45._0_4_ = auVar100._0_4_ * (float)local_3c0._0_4_;
        auVar45._8_4_ = auVar100._8_4_ * fStack_3b8;
        auVar45._12_4_ = auVar100._12_4_ * fStack_3b4;
        auVar45._16_4_ = auVar100._16_4_ * fStack_3b0;
        auVar45._20_4_ = auVar100._20_4_ * fStack_3ac;
        auVar45._24_4_ = auVar100._24_4_ * fStack_3a8;
        auVar45._28_4_ = uStack_3a4;
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar101,local_7a0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar101,auVar108);
        auVar94 = vfmadd231ps_avx512vl(auVar45,auVar101,local_3a0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar106);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar99);
        auVar77 = vfmadd231ps_fma(auVar94,auVar89,local_380);
        auVar94 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar107);
        auVar95 = vfmadd231ps_avx512vl(auVar91,auVar88,local_6e0);
        auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar88,local_360);
        auVar96 = vmaxps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar77));
        auVar90 = vsubps_avx(auVar94,auVar92);
        auVar91 = vsubps_avx(auVar95,auVar93);
        auVar97 = vmulps_avx512vl(auVar93,auVar90);
        auVar98 = vmulps_avx512vl(auVar92,auVar91);
        auVar97 = vsubps_avx512vl(auVar97,auVar98);
        auVar98 = vmulps_avx512vl(auVar91,auVar91);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar90);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        auVar96 = vmulps_avx512vl(auVar96,auVar98);
        auVar97 = vmulps_avx512vl(auVar97,auVar97);
        uVar144 = vcmpps_avx512vl(auVar97,auVar96,2);
        bVar74 = (byte)uVar31 & (byte)uVar144;
        if (bVar74 == 0) {
          auVar189 = ZEXT3264(auVar106);
          auVar140 = ZEXT3264(auVar99);
        }
        else {
          auVar100 = vmulps_avx512vl(local_780,auVar100);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_420,auVar100);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_400,auVar101);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_3e0,auVar89);
          auVar102 = vmulps_avx512vl(local_780,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_420,auVar102);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_400,auVar103);
          auVar89 = vfmadd213ps_avx512vl(auVar104,local_3e0,auVar105);
          auVar104 = *(undefined1 (*) [32])(lVar72 + 0x220557c + lVar67 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar72 + 0x2205a00 + lVar67 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar72 + 0x2205e84 + lVar67 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar72 + 0x2206308 + lVar67 * 4);
          auVar101 = vmulps_avx512vl(local_7c0,auVar102);
          auVar100 = vmulps_avx512vl(local_7e0,auVar102);
          auVar102 = vmulps_avx512vl(local_780,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_7a0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar108);
          auVar103 = vfmadd231ps_avx512vl(auVar102,local_420,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar101,auVar105,auVar106);
          auVar101 = vfmadd231ps_avx512vl(auVar100,auVar105,auVar99);
          auVar105 = vfmadd231ps_avx512vl(auVar103,local_400,auVar105);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar107);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,local_6e0);
          auVar100 = vfmadd231ps_avx512vl(auVar105,local_3e0,auVar104);
          auVar104 = *(undefined1 (*) [32])(lVar72 + 0x220799c + lVar67 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar72 + 0x22082a4 + lVar67 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar72 + 0x2208728 + lVar67 * 4);
          auVar96 = vmulps_avx512vl(local_7c0,auVar103);
          auVar97 = vmulps_avx512vl(local_7e0,auVar103);
          auVar103 = vmulps_avx512vl(local_780,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_7a0);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar108);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_420,auVar105);
          auVar105 = *(undefined1 (*) [32])(lVar72 + 0x2207e20 + lVar67 * 4);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,auVar106);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar99);
          auVar105 = vfmadd231ps_avx512vl(auVar103,local_400,auVar105);
          auVar103 = vfmadd231ps_avx512vl(auVar96,auVar104,auVar107);
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar104,local_6e0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_3e0,auVar104);
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar102,auVar97);
          vandps_avx512vl(auVar101,auVar97);
          auVar104 = vmaxps_avx(auVar97,auVar97);
          vandps_avx512vl(auVar100,auVar97);
          auVar104 = vmaxps_avx(auVar104,auVar97);
          uVar69 = vcmpps_avx512vl(auVar104,local_740,1);
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar114._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar102._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar102._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar102._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar102._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar102._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar102._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar102._24_4_)
          ;
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar114._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar102._28_4_;
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar115._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar101._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar101._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar101._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar101._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar101._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar101._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar101._24_4_)
          ;
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar115._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar101._28_4_;
          vandps_avx512vl(auVar103,auVar97);
          vandps_avx512vl(auVar96,auVar97);
          auVar104 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar105,auVar97);
          auVar104 = vmaxps_avx(auVar104,auVar115);
          uVar69 = vcmpps_avx512vl(auVar104,local_740,1);
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar116._0_4_ = (uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar103._0_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar103._4_4_;
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar103._8_4_;
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar103._12_4_;
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar103._16_4_;
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar103._20_4_;
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar103._24_4_;
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar116._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar103._28_4_;
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar117._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar96._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar96._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar96._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar96._12_4_);
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar96._16_4_);
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar96._20_4_);
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar96._24_4_);
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar117._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar96._28_4_;
          auVar181._8_4_ = 0x80000000;
          auVar181._0_8_ = 0x8000000080000000;
          auVar181._12_4_ = 0x80000000;
          auVar181._16_4_ = 0x80000000;
          auVar181._20_4_ = 0x80000000;
          auVar181._24_4_ = 0x80000000;
          auVar181._28_4_ = 0x80000000;
          auVar104 = vxorps_avx512vl(auVar116,auVar181);
          auVar96 = auVar191._0_32_;
          auVar105 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar96);
          auVar147 = vfmadd231ps_fma(auVar105,auVar115,auVar115);
          auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar147));
          auVar188._8_4_ = 0xbf000000;
          auVar188._0_8_ = 0xbf000000bf000000;
          auVar188._12_4_ = 0xbf000000;
          auVar188._16_4_ = 0xbf000000;
          auVar188._20_4_ = 0xbf000000;
          auVar188._24_4_ = 0xbf000000;
          auVar188._28_4_ = 0xbf000000;
          fVar151 = auVar105._0_4_;
          fVar141 = auVar105._4_4_;
          fVar142 = auVar105._8_4_;
          fVar143 = auVar105._12_4_;
          fVar171 = auVar105._16_4_;
          fVar175 = auVar105._20_4_;
          fVar75 = auVar105._24_4_;
          auVar46._4_4_ = fVar141 * fVar141 * fVar141 * auVar147._4_4_ * -0.5;
          auVar46._0_4_ = fVar151 * fVar151 * fVar151 * auVar147._0_4_ * -0.5;
          auVar46._8_4_ = fVar142 * fVar142 * fVar142 * auVar147._8_4_ * -0.5;
          auVar46._12_4_ = fVar143 * fVar143 * fVar143 * auVar147._12_4_ * -0.5;
          auVar46._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar46._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar46._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
          auVar46._28_4_ = auVar115._28_4_;
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar105 = vfmadd231ps_avx512vl(auVar46,auVar103,auVar105);
          auVar47._4_4_ = auVar115._4_4_ * auVar105._4_4_;
          auVar47._0_4_ = auVar115._0_4_ * auVar105._0_4_;
          auVar47._8_4_ = auVar115._8_4_ * auVar105._8_4_;
          auVar47._12_4_ = auVar115._12_4_ * auVar105._12_4_;
          auVar47._16_4_ = auVar115._16_4_ * auVar105._16_4_;
          auVar47._20_4_ = auVar115._20_4_ * auVar105._20_4_;
          auVar47._24_4_ = auVar115._24_4_ * auVar105._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar105._4_4_ * -auVar114._4_4_;
          auVar48._0_4_ = auVar105._0_4_ * -auVar114._0_4_;
          auVar48._8_4_ = auVar105._8_4_ * -auVar114._8_4_;
          auVar48._12_4_ = auVar105._12_4_ * -auVar114._12_4_;
          auVar48._16_4_ = auVar105._16_4_ * -auVar114._16_4_;
          auVar48._20_4_ = auVar105._20_4_ * -auVar114._20_4_;
          auVar48._24_4_ = auVar105._24_4_ * -auVar114._24_4_;
          auVar48._28_4_ = auVar115._28_4_;
          auVar102 = vmulps_avx512vl(auVar105,auVar96);
          auVar105 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar96);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar117,auVar117);
          auVar101 = vrsqrt14ps_avx512vl(auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar188);
          fVar151 = auVar101._0_4_;
          fVar141 = auVar101._4_4_;
          fVar142 = auVar101._8_4_;
          fVar143 = auVar101._12_4_;
          fVar171 = auVar101._16_4_;
          fVar175 = auVar101._20_4_;
          fVar75 = auVar101._24_4_;
          auVar49._4_4_ = fVar141 * fVar141 * fVar141 * auVar105._4_4_;
          auVar49._0_4_ = fVar151 * fVar151 * fVar151 * auVar105._0_4_;
          auVar49._8_4_ = fVar142 * fVar142 * fVar142 * auVar105._8_4_;
          auVar49._12_4_ = fVar143 * fVar143 * fVar143 * auVar105._12_4_;
          auVar49._16_4_ = fVar171 * fVar171 * fVar171 * auVar105._16_4_;
          auVar49._20_4_ = fVar175 * fVar175 * fVar175 * auVar105._20_4_;
          auVar49._24_4_ = fVar75 * fVar75 * fVar75 * auVar105._24_4_;
          auVar49._28_4_ = auVar105._28_4_;
          auVar105 = vfmadd231ps_avx512vl(auVar49,auVar103,auVar101);
          auVar50._4_4_ = auVar117._4_4_ * auVar105._4_4_;
          auVar50._0_4_ = auVar117._0_4_ * auVar105._0_4_;
          auVar50._8_4_ = auVar117._8_4_ * auVar105._8_4_;
          auVar50._12_4_ = auVar117._12_4_ * auVar105._12_4_;
          auVar50._16_4_ = auVar117._16_4_ * auVar105._16_4_;
          auVar50._20_4_ = auVar117._20_4_ * auVar105._20_4_;
          auVar50._24_4_ = auVar117._24_4_ * auVar105._24_4_;
          auVar50._28_4_ = auVar101._28_4_;
          auVar51._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar51._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar51._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar51._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar51._16_4_ = auVar105._16_4_ * auVar104._16_4_;
          auVar51._20_4_ = auVar105._20_4_ * auVar104._20_4_;
          auVar51._24_4_ = auVar105._24_4_ * auVar104._24_4_;
          auVar51._28_4_ = auVar104._28_4_;
          auVar104 = vmulps_avx512vl(auVar105,auVar96);
          auVar147 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar83),auVar92);
          auVar105 = ZEXT1632(auVar83);
          auVar27 = vfmadd213ps_fma(auVar48,auVar105,auVar93);
          auVar103 = vfmadd213ps_avx512vl(auVar102,auVar105,auVar89);
          auVar101 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar77),auVar94);
          auVar82 = vfnmadd213ps_fma(auVar47,auVar105,auVar92);
          auVar100 = ZEXT1632(auVar77);
          auVar29 = vfmadd213ps_fma(auVar51,auVar100,auVar95);
          auVar81 = vfnmadd213ps_fma(auVar48,auVar105,auVar93);
          auVar79 = vfmadd213ps_fma(auVar104,auVar100,auVar88);
          auVar93 = ZEXT1632(auVar83);
          auVar137 = vfnmadd231ps_fma(auVar89,auVar93,auVar102);
          auVar86 = vfnmadd213ps_fma(auVar50,auVar100,auVar94);
          auVar136 = vfnmadd213ps_fma(auVar51,auVar100,auVar95);
          auVar145 = vfnmadd231ps_fma(auVar88,ZEXT1632(auVar77),auVar104);
          auVar88 = vsubps_avx512vl(auVar101,ZEXT1632(auVar82));
          auVar104 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar81));
          auVar105 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar137));
          auVar52._4_4_ = auVar104._4_4_ * auVar137._4_4_;
          auVar52._0_4_ = auVar104._0_4_ * auVar137._0_4_;
          auVar52._8_4_ = auVar104._8_4_ * auVar137._8_4_;
          auVar52._12_4_ = auVar104._12_4_ * auVar137._12_4_;
          auVar52._16_4_ = auVar104._16_4_ * 0.0;
          auVar52._20_4_ = auVar104._20_4_ * 0.0;
          auVar52._24_4_ = auVar104._24_4_ * 0.0;
          auVar52._28_4_ = auVar102._28_4_;
          auVar83 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar81),auVar105);
          auVar53._4_4_ = auVar105._4_4_ * auVar82._4_4_;
          auVar53._0_4_ = auVar105._0_4_ * auVar82._0_4_;
          auVar53._8_4_ = auVar105._8_4_ * auVar82._8_4_;
          auVar53._12_4_ = auVar105._12_4_ * auVar82._12_4_;
          auVar53._16_4_ = auVar105._16_4_ * 0.0;
          auVar53._20_4_ = auVar105._20_4_ * 0.0;
          auVar53._24_4_ = auVar105._24_4_ * 0.0;
          auVar53._28_4_ = auVar105._28_4_;
          auVar85 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar137),auVar88);
          auVar54._4_4_ = auVar81._4_4_ * auVar88._4_4_;
          auVar54._0_4_ = auVar81._0_4_ * auVar88._0_4_;
          auVar54._8_4_ = auVar81._8_4_ * auVar88._8_4_;
          auVar54._12_4_ = auVar81._12_4_ * auVar88._12_4_;
          auVar54._16_4_ = auVar88._16_4_ * 0.0;
          auVar54._20_4_ = auVar88._20_4_ * 0.0;
          auVar54._24_4_ = auVar88._24_4_ * 0.0;
          auVar54._28_4_ = auVar88._28_4_;
          auVar80 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar82),auVar104);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar96,ZEXT1632(auVar85));
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,ZEXT1632(auVar83));
          uVar69 = vcmpps_avx512vl(auVar104,auVar96,2);
          bVar66 = (byte)uVar69;
          fVar127 = (float)((uint)(bVar66 & 1) * auVar147._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar86._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar129 = (float)((uint)bVar12 * auVar147._4_4_ | (uint)!bVar12 * auVar86._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar132 = (float)((uint)bVar12 * auVar147._8_4_ | (uint)!bVar12 * auVar86._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar133 = (float)((uint)bVar12 * auVar147._12_4_ | (uint)!bVar12 * auVar86._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar132,CONCAT44(fVar129,fVar127))));
          fVar128 = (float)((uint)(bVar66 & 1) * auVar27._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar136._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar131 = (float)((uint)bVar12 * auVar27._4_4_ | (uint)!bVar12 * auVar136._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar130 = (float)((uint)bVar12 * auVar27._8_4_ | (uint)!bVar12 * auVar136._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar134 = (float)((uint)bVar12 * auVar27._12_4_ | (uint)!bVar12 * auVar136._12_4_);
          auVar90 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar130,CONCAT44(fVar131,fVar128))));
          auVar118._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar145._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar145._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar145._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar118._12_4_ =
               (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar145._12_4_);
          fVar151 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_);
          auVar118._16_4_ = fVar151;
          fVar141 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_);
          auVar118._20_4_ = fVar141;
          fVar142 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_);
          auVar118._24_4_ = fVar142;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar103._28_4_;
          auVar118._28_4_ = iVar1;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar101);
          auVar119._0_4_ =
               (uint)(bVar66 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar83._0_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar83._4_4_;
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar83._8_4_;
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar83._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar29));
          auVar120._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar147._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar147._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar147._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ =
               (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar147._12_4_);
          fVar143 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
          auVar120._16_4_ = fVar143;
          fVar171 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
          auVar120._20_4_ = fVar171;
          fVar175 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
          auVar120._24_4_ = fVar175;
          auVar120._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar137),ZEXT1632(auVar79));
          auVar121._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar27._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar27._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar27._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar27._12_4_)
          ;
          fVar126 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
          auVar121._16_4_ = fVar126;
          fVar76 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
          auVar121._20_4_ = fVar76;
          fVar75 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
          auVar121._24_4_ = fVar75;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
          auVar121._28_4_ = iVar2;
          auVar122._0_4_ =
               (uint)(bVar66 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar101._0_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar12 * (int)auVar82._4_4_ | (uint)!bVar12 * auVar101._4_4_;
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar12 * (int)auVar82._8_4_ | (uint)!bVar12 * auVar101._8_4_;
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar12 * (int)auVar82._12_4_ | (uint)!bVar12 * auVar101._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar101._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar101._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar101._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar101._28_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar101 = vsubps_avx512vl(auVar122,auVar100);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar81._12_4_ |
                                                   (uint)!bVar16 * auVar29._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar81._8_4_ |
                                                            (uint)!bVar14 * auVar29._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar81._4_4_ |
                                                                     (uint)!bVar12 * auVar29._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar81._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar29._0_4_)))),auVar90);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar137._12_4_ |
                                                   (uint)!bVar17 * auVar79._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar137._8_4_ |
                                                            (uint)!bVar15 * auVar79._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar137._4_4_ |
                                                                     (uint)!bVar13 * auVar79._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar137._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar79._0_4_)))),auVar118);
          auVar102 = vsubps_avx(auVar100,auVar119);
          auVar88 = vsubps_avx(auVar90,auVar120);
          auVar89 = vsubps_avx(auVar118,auVar121);
          auVar55._4_4_ = auVar103._4_4_ * fVar129;
          auVar55._0_4_ = auVar103._0_4_ * fVar127;
          auVar55._8_4_ = auVar103._8_4_ * fVar132;
          auVar55._12_4_ = auVar103._12_4_ * fVar133;
          auVar55._16_4_ = auVar103._16_4_ * 0.0;
          auVar55._20_4_ = auVar103._20_4_ * 0.0;
          auVar55._24_4_ = auVar103._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar55,auVar118,auVar101);
          auVar161._0_4_ = fVar128 * auVar101._0_4_;
          auVar161._4_4_ = fVar131 * auVar101._4_4_;
          auVar161._8_4_ = fVar130 * auVar101._8_4_;
          auVar161._12_4_ = fVar134 * auVar101._12_4_;
          auVar161._16_4_ = auVar101._16_4_ * 0.0;
          auVar161._20_4_ = auVar101._20_4_ * 0.0;
          auVar161._24_4_ = auVar101._24_4_ * 0.0;
          auVar161._28_4_ = 0;
          auVar147 = vfmsub231ps_fma(auVar161,auVar100,auVar105);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar147),auVar96,ZEXT1632(auVar83));
          auVar166._0_4_ = auVar105._0_4_ * auVar118._0_4_;
          auVar166._4_4_ = auVar105._4_4_ * auVar118._4_4_;
          auVar166._8_4_ = auVar105._8_4_ * auVar118._8_4_;
          auVar166._12_4_ = auVar105._12_4_ * auVar118._12_4_;
          auVar166._16_4_ = auVar105._16_4_ * fVar151;
          auVar166._20_4_ = auVar105._20_4_ * fVar141;
          auVar166._24_4_ = auVar105._24_4_ * fVar142;
          auVar166._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar166,auVar90,auVar103);
          auVar91 = vfmadd231ps_avx512vl(auVar104,auVar96,ZEXT1632(auVar83));
          auVar104 = vmulps_avx512vl(auVar89,auVar119);
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar102,auVar121);
          auVar56._4_4_ = auVar88._4_4_ * auVar121._4_4_;
          auVar56._0_4_ = auVar88._0_4_ * auVar121._0_4_;
          auVar56._8_4_ = auVar88._8_4_ * auVar121._8_4_;
          auVar56._12_4_ = auVar88._12_4_ * auVar121._12_4_;
          auVar56._16_4_ = auVar88._16_4_ * fVar126;
          auVar56._20_4_ = auVar88._20_4_ * fVar76;
          auVar56._24_4_ = auVar88._24_4_ * fVar75;
          auVar56._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar56,auVar120,auVar89);
          auVar167._0_4_ = auVar120._0_4_ * auVar102._0_4_;
          auVar167._4_4_ = auVar120._4_4_ * auVar102._4_4_;
          auVar167._8_4_ = auVar120._8_4_ * auVar102._8_4_;
          auVar167._12_4_ = auVar120._12_4_ * auVar102._12_4_;
          auVar167._16_4_ = fVar143 * auVar102._16_4_;
          auVar167._20_4_ = fVar171 * auVar102._20_4_;
          auVar167._24_4_ = fVar175 * auVar102._24_4_;
          auVar167._28_4_ = 0;
          auVar147 = vfmsub231ps_fma(auVar167,auVar88,auVar119);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar147),auVar96,auVar104);
          auVar92 = vfmadd231ps_avx512vl(auVar104,auVar96,ZEXT1632(auVar83));
          auVar104 = vmaxps_avx(auVar91,auVar92);
          uVar144 = vcmpps_avx512vl(auVar104,auVar96,2);
          bVar74 = bVar74 & (byte)uVar144;
          if (bVar74 != 0) {
            auVar57._4_4_ = auVar89._4_4_ * auVar105._4_4_;
            auVar57._0_4_ = auVar89._0_4_ * auVar105._0_4_;
            auVar57._8_4_ = auVar89._8_4_ * auVar105._8_4_;
            auVar57._12_4_ = auVar89._12_4_ * auVar105._12_4_;
            auVar57._16_4_ = auVar89._16_4_ * auVar105._16_4_;
            auVar57._20_4_ = auVar89._20_4_ * auVar105._20_4_;
            auVar57._24_4_ = auVar89._24_4_ * auVar105._24_4_;
            auVar57._28_4_ = auVar104._28_4_;
            auVar27 = vfmsub231ps_fma(auVar57,auVar88,auVar103);
            auVar58._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar58._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar58._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar58._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar58._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar58._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar58._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar58._28_4_ = auVar103._28_4_;
            auVar147 = vfmsub231ps_fma(auVar58,auVar101,auVar89);
            auVar59._4_4_ = auVar88._4_4_ * auVar101._4_4_;
            auVar59._0_4_ = auVar88._0_4_ * auVar101._0_4_;
            auVar59._8_4_ = auVar88._8_4_ * auVar101._8_4_;
            auVar59._12_4_ = auVar88._12_4_ * auVar101._12_4_;
            auVar59._16_4_ = auVar88._16_4_ * auVar101._16_4_;
            auVar59._20_4_ = auVar88._20_4_ * auVar101._20_4_;
            auVar59._24_4_ = auVar88._24_4_ * auVar101._24_4_;
            auVar59._28_4_ = auVar88._28_4_;
            auVar29 = vfmsub231ps_fma(auVar59,auVar102,auVar105);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar147),ZEXT1632(auVar29));
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar27),auVar96);
            auVar105 = vrcp14ps_avx512vl(auVar104);
            auVar102 = auVar190._0_32_;
            auVar103 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar102);
            auVar83 = vfmadd132ps_fma(auVar103,auVar105,auVar105);
            auVar60._4_4_ = auVar29._4_4_ * auVar118._4_4_;
            auVar60._0_4_ = auVar29._0_4_ * auVar118._0_4_;
            auVar60._8_4_ = auVar29._8_4_ * auVar118._8_4_;
            auVar60._12_4_ = auVar29._12_4_ * auVar118._12_4_;
            auVar60._16_4_ = fVar151 * 0.0;
            auVar60._20_4_ = fVar141 * 0.0;
            auVar60._24_4_ = fVar142 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar147 = vfmadd231ps_fma(auVar60,auVar90,ZEXT1632(auVar147));
            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar100,ZEXT1632(auVar27));
            fVar151 = auVar83._0_4_;
            fVar141 = auVar83._4_4_;
            fVar142 = auVar83._8_4_;
            fVar143 = auVar83._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar147._12_4_ * fVar143,
                                           CONCAT48(auVar147._8_4_ * fVar142,
                                                    CONCAT44(auVar147._4_4_ * fVar141,
                                                             auVar147._0_4_ * fVar151))));
            auVar65._4_4_ = uStack_61c;
            auVar65._0_4_ = local_620;
            auVar65._8_4_ = uStack_618;
            auVar65._12_4_ = uStack_614;
            auVar65._16_4_ = uStack_610;
            auVar65._20_4_ = uStack_60c;
            auVar65._24_4_ = uStack_608;
            auVar65._28_4_ = uStack_604;
            uVar144 = vcmpps_avx512vl(local_5a0,auVar65,0xd);
            uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar36._4_4_ = uVar135;
            auVar36._0_4_ = uVar135;
            auVar36._8_4_ = uVar135;
            auVar36._12_4_ = uVar135;
            auVar36._16_4_ = uVar135;
            auVar36._20_4_ = uVar135;
            auVar36._24_4_ = uVar135;
            auVar36._28_4_ = uVar135;
            uVar31 = vcmpps_avx512vl(local_5a0,auVar36,2);
            bVar74 = (byte)uVar144 & (byte)uVar31 & bVar74;
            if (bVar74 != 0) {
              uVar144 = vcmpps_avx512vl(auVar104,auVar96,4);
              bVar74 = bVar74 & (byte)uVar144;
              auVar189 = ZEXT3264(local_820);
              auVar140 = ZEXT3264(local_800);
              if (bVar74 != 0) {
                fVar171 = auVar91._0_4_ * fVar151;
                fVar175 = auVar91._4_4_ * fVar141;
                auVar61._4_4_ = fVar175;
                auVar61._0_4_ = fVar171;
                fVar75 = auVar91._8_4_ * fVar142;
                auVar61._8_4_ = fVar75;
                fVar76 = auVar91._12_4_ * fVar143;
                auVar61._12_4_ = fVar76;
                fVar126 = auVar91._16_4_ * 0.0;
                auVar61._16_4_ = fVar126;
                fVar127 = auVar91._20_4_ * 0.0;
                auVar61._20_4_ = fVar127;
                fVar128 = auVar91._24_4_ * 0.0;
                auVar61._24_4_ = fVar128;
                auVar61._28_4_ = auVar104._28_4_;
                auVar105 = vsubps_avx512vl(auVar102,auVar61);
                local_5e0._0_4_ =
                     (float)((uint)(bVar66 & 1) * (int)fVar171 |
                            (uint)!(bool)(bVar66 & 1) * auVar105._0_4_);
                bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar175 | (uint)!bVar12 * auVar105._4_4_);
                bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar105._8_4_);
                bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar76 | (uint)!bVar12 * auVar105._12_4_);
                bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar126 | (uint)!bVar12 * auVar105._16_4_);
                bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar127 | (uint)!bVar12 * auVar105._20_4_);
                bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar128 | (uint)!bVar12 * auVar105._24_4_);
                bVar12 = SUB81(uVar69 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar12 * auVar104._28_4_ | (uint)!bVar12 * auVar105._28_4_);
                auVar104 = vsubps_avx(ZEXT1632(auVar77),auVar93);
                auVar83 = vfmadd213ps_fma(auVar104,local_5e0,auVar93);
                uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar37._4_4_ = uVar135;
                auVar37._0_4_ = uVar135;
                auVar37._8_4_ = uVar135;
                auVar37._12_4_ = uVar135;
                auVar37._16_4_ = uVar135;
                auVar37._20_4_ = uVar135;
                auVar37._24_4_ = uVar135;
                auVar37._28_4_ = uVar135;
                auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                              CONCAT48(auVar83._8_4_ + auVar83._8_4_
                                                                       ,CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                           auVar37);
                uVar144 = vcmpps_avx512vl(local_5a0,auVar104,6);
                if (((byte)uVar144 & bVar74) != 0) {
                  auVar148._0_4_ = auVar92._0_4_ * fVar151;
                  auVar148._4_4_ = auVar92._4_4_ * fVar141;
                  auVar148._8_4_ = auVar92._8_4_ * fVar142;
                  auVar148._12_4_ = auVar92._12_4_ * fVar143;
                  auVar148._16_4_ = auVar92._16_4_ * 0.0;
                  auVar148._20_4_ = auVar92._20_4_ * 0.0;
                  auVar148._24_4_ = auVar92._24_4_ * 0.0;
                  auVar148._28_4_ = 0;
                  auVar104 = vsubps_avx512vl(auVar102,auVar148);
                  auVar123._0_4_ =
                       (uint)(bVar66 & 1) * (int)auVar148._0_4_ |
                       (uint)!(bool)(bVar66 & 1) * auVar104._0_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar123._4_4_ =
                       (uint)bVar12 * (int)auVar148._4_4_ | (uint)!bVar12 * auVar104._4_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar123._8_4_ =
                       (uint)bVar12 * (int)auVar148._8_4_ | (uint)!bVar12 * auVar104._8_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar123._12_4_ =
                       (uint)bVar12 * (int)auVar148._12_4_ | (uint)!bVar12 * auVar104._12_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar123._16_4_ =
                       (uint)bVar12 * (int)auVar148._16_4_ | (uint)!bVar12 * auVar104._16_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar123._20_4_ =
                       (uint)bVar12 * (int)auVar148._20_4_ | (uint)!bVar12 * auVar104._20_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar123._24_4_ =
                       (uint)bVar12 * (int)auVar148._24_4_ | (uint)!bVar12 * auVar104._24_4_;
                  auVar123._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar104._28_4_;
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar38._16_4_ = 0x40000000;
                  auVar38._20_4_ = 0x40000000;
                  auVar38._24_4_ = 0x40000000;
                  auVar38._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar123,auVar102,auVar38);
                  local_580 = (undefined4)lVar67;
                  pGVar10 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar66 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar66 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar83 = vcvtsi2ss_avx512f(auVar190._0_16_,local_580);
                    fVar151 = auVar83._0_4_;
                    local_520[0] = (fVar151 + local_5e0._0_4_ + 0.0) * (float)local_6a0;
                    local_520[1] = (fVar151 + local_5e0._4_4_ + 1.0) * local_6a0._4_4_;
                    local_520[2] = (fVar151 + local_5e0._8_4_ + 2.0) * fStack_698;
                    local_520[3] = (fVar151 + local_5e0._12_4_ + 3.0) * fStack_694;
                    fStack_510 = (fVar151 + local_5e0._16_4_ + 4.0) * fStack_690;
                    fStack_50c = (fVar151 + local_5e0._20_4_ + 5.0) * fStack_68c;
                    fStack_508 = (fVar151 + local_5e0._24_4_ + 6.0) * fStack_688;
                    fStack_504 = fVar151 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    uVar69 = 0;
                    uVar68 = (ulong)((byte)uVar144 & bVar74);
                    for (uVar71 = uVar68; local_57c = iVar9, local_570 = auVar84, local_560 = uVar30
                        , uStack_558 = uVar32, local_550 = uVar62, uStack_548 = uVar63,
                        (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                      uVar69 = uVar69 + 1;
                    }
                    while (auVar83 = auVar191._0_16_, uVar68 != 0) {
                      uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar69]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar69 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar69 * 4)
                      ;
                      local_850.context = context->user;
                      fVar141 = local_200._0_4_;
                      fVar151 = 1.0 - fVar141;
                      auVar27 = vfnmadd231ss_fma(ZEXT416((uint)(fVar141 * (fVar151 + fVar151))),
                                                 ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                      auVar147 = local_200._0_16_;
                      auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                                ZEXT416(0xc0a00000));
                      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141 * 3.0)),
                                                ZEXT416((uint)(fVar141 + fVar141)),auVar83);
                      auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                                ZEXT416(0x40000000));
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                                ZEXT416((uint)(fVar151 + fVar151)),auVar83);
                      auVar147 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),auVar147,
                                                 ZEXT416((uint)(fVar151 * -2.0)));
                      fVar151 = auVar27._0_4_ * 0.5;
                      fVar141 = auVar77._0_4_ * 0.5;
                      fVar142 = auVar83._0_4_ * 0.5;
                      fVar143 = auVar147._0_4_ * 0.5;
                      auVar159._0_4_ = fVar143 * local_760;
                      auVar159._4_4_ = fVar143 * fStack_75c;
                      auVar159._8_4_ = fVar143 * fStack_758;
                      auVar159._12_4_ = fVar143 * fStack_754;
                      auVar170._4_4_ = fVar142;
                      auVar170._0_4_ = fVar142;
                      auVar170._8_4_ = fVar142;
                      auVar170._12_4_ = fVar142;
                      auVar83 = vfmadd132ps_fma(auVar170,auVar159,auVar78);
                      auVar160._4_4_ = fVar141;
                      auVar160._0_4_ = fVar141;
                      auVar160._8_4_ = fVar141;
                      auVar160._12_4_ = fVar141;
                      auVar83 = vfmadd132ps_fma(auVar160,auVar83,auVar28);
                      auVar139._4_4_ = fVar151;
                      auVar139._0_4_ = fVar151;
                      auVar139._8_4_ = fVar151;
                      auVar139._12_4_ = fVar151;
                      auVar83 = vfmadd213ps_fma(auVar139,auVar84,auVar83);
                      auVar140 = vbroadcastss_avx512f(auVar83);
                      auVar196 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar196,ZEXT1664(auVar83));
                      auVar196 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar196,ZEXT1664(auVar83));
                      local_2c0[0] = (RTCHitN)auVar140[0];
                      local_2c0[1] = (RTCHitN)auVar140[1];
                      local_2c0[2] = (RTCHitN)auVar140[2];
                      local_2c0[3] = (RTCHitN)auVar140[3];
                      local_2c0[4] = (RTCHitN)auVar140[4];
                      local_2c0[5] = (RTCHitN)auVar140[5];
                      local_2c0[6] = (RTCHitN)auVar140[6];
                      local_2c0[7] = (RTCHitN)auVar140[7];
                      local_2c0[8] = (RTCHitN)auVar140[8];
                      local_2c0[9] = (RTCHitN)auVar140[9];
                      local_2c0[10] = (RTCHitN)auVar140[10];
                      local_2c0[0xb] = (RTCHitN)auVar140[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar140[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar140[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar140[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar140[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar140[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar140[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar140[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar140[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar140[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar140[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar140[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar140[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar140[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar140[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar140[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar140[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar140[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar140[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar140[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar140[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar140[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar140[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar140[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar140[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar140[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar140[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar140[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar140[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar140[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar140[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar140[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar140[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar140[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar140[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar140[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar140[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar140[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar140[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar140[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar140[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar140[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar140[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar140[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar140[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar140[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar140[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar140[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar140[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar140[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar140[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar140[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar140[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar140 = vmovdqa64_avx512f(local_480);
                      local_140 = vmovdqa64_avx512f(auVar140);
                      vpcmpeqd_avx2(auVar140._0_32_,auVar140._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_850.context)->instPrimID[0]));
                      auVar140 = vmovdqa64_avx512f(local_340);
                      local_680 = vmovdqa64_avx512f(auVar140);
                      local_850.valid = (int *)local_680;
                      local_850.geometryUserPtr = pGVar10->userPtr;
                      local_850.hit = local_2c0;
                      local_850.N = 0x10;
                      local_4c0._0_8_ = uVar69;
                      uVar71 = uVar69;
                      local_850.ray = (RTCRayN *)ray;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar10->occlusionFilterN)(&local_850);
                        auVar140 = vmovdqa64_avx512f(local_680);
                        uVar71 = local_4c0._0_8_;
                      }
                      uVar144 = vptestmd_avx512f(auVar140,auVar140);
                      if ((short)uVar144 != 0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_850);
                          auVar140 = vmovdqa64_avx512f(local_680);
                          uVar71 = local_4c0._0_8_;
                        }
                        auVar83 = auVar191._0_16_;
                        uVar69 = vptestmd_avx512f(auVar140,auVar140);
                        auVar196 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar69 & 1);
                        auVar140._0_4_ =
                             (uint)bVar12 * auVar196._0_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x200);
                        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                        auVar140._4_4_ =
                             (uint)bVar12 * auVar196._4_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x204);
                        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                        auVar140._8_4_ =
                             (uint)bVar12 * auVar196._8_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x208);
                        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                        auVar140._12_4_ =
                             (uint)bVar12 * auVar196._12_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x20c);
                        bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                        auVar140._16_4_ =
                             (uint)bVar12 * auVar196._16_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x210);
                        bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                        auVar140._20_4_ =
                             (uint)bVar12 * auVar196._20_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x214);
                        bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                        auVar140._24_4_ =
                             (uint)bVar12 * auVar196._24_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x218);
                        bVar12 = (bool)((byte)(uVar69 >> 7) & 1);
                        auVar140._28_4_ =
                             (uint)bVar12 * auVar196._28_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x21c);
                        bVar12 = (bool)((byte)(uVar69 >> 8) & 1);
                        auVar140._32_4_ =
                             (uint)bVar12 * auVar196._32_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x220);
                        bVar12 = (bool)((byte)(uVar69 >> 9) & 1);
                        auVar140._36_4_ =
                             (uint)bVar12 * auVar196._36_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x224);
                        bVar12 = (bool)((byte)(uVar69 >> 10) & 1);
                        auVar140._40_4_ =
                             (uint)bVar12 * auVar196._40_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x228);
                        bVar12 = (bool)((byte)(uVar69 >> 0xb) & 1);
                        auVar140._44_4_ =
                             (uint)bVar12 * auVar196._44_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x22c);
                        bVar12 = (bool)((byte)(uVar69 >> 0xc) & 1);
                        auVar140._48_4_ =
                             (uint)bVar12 * auVar196._48_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x230);
                        bVar12 = (bool)((byte)(uVar69 >> 0xd) & 1);
                        auVar140._52_4_ =
                             (uint)bVar12 * auVar196._52_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x234);
                        bVar12 = (bool)((byte)(uVar69 >> 0xe) & 1);
                        auVar140._56_4_ =
                             (uint)bVar12 * auVar196._56_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x238);
                        bVar12 = SUB81(uVar69 >> 0xf,0);
                        auVar140._60_4_ =
                             (uint)bVar12 * auVar196._60_4_ |
                             (uint)!bVar12 * *(int *)(local_850.ray + 0x23c);
                        *(undefined1 (*) [64])(local_850.ray + 0x200) = auVar140;
                        if ((short)uVar69 != 0) {
                          bVar66 = 1;
                          goto LAB_0180d15b;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar135;
                      uVar69 = 0;
                      uVar68 = uVar68 ^ 1L << (uVar71 & 0x3f);
                      for (uVar71 = uVar68; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        uVar69 = uVar69 + 1;
                      }
                    }
                    bVar66 = 0;
LAB_0180d15b:
                    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar190 = ZEXT3264(auVar104);
                    auVar83 = vxorps_avx512vl(auVar83,auVar83);
                    auVar191 = ZEXT1664(auVar83);
                    auVar192 = ZEXT3264(local_700);
                    auVar193 = ZEXT3264(local_6e0);
                    auVar189 = ZEXT3264(local_820);
                    auVar140 = ZEXT3264(local_800);
                    auVar194 = ZEXT3264(local_7a0);
                    auVar195 = ZEXT3264(local_720);
                    auVar196 = ZEXT3264(local_7c0);
                    auVar197 = ZEXT3264(local_7e0);
                  }
                  bVar70 = (bool)(bVar70 | bVar66);
                }
              }
              goto LAB_0180d13a;
            }
          }
          auVar189 = ZEXT3264(local_820);
          auVar140 = ZEXT3264(local_800);
        }
LAB_0180d13a:
      }
    }
    if (bVar70) break;
    uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar33._4_4_ = uVar135;
    auVar33._0_4_ = uVar135;
    auVar33._8_4_ = uVar135;
    auVar33._12_4_ = uVar135;
    uVar30 = vcmpps_avx512vl(local_5f0,auVar33,2);
    local_748 = (ulong)((uint)uVar73 & (uint)uVar30);
  }
  return local_748 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }